

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_vertical_8_dual_sse2
               (uint16_t *s,int p,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,uint8_t *blimit1
               ,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  longlong lVar20;
  longlong lVar21;
  longlong lVar22;
  longlong lVar23;
  longlong lVar24;
  longlong lVar25;
  longlong lVar26;
  longlong lVar27;
  longlong lVar28;
  longlong lVar29;
  longlong lVar30;
  longlong lVar31;
  longlong lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i *palVar42;
  undefined1 (*pauVar43) [16];
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 *puVar46;
  longlong *plVar47;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  uint8_t *in_R8;
  uint8_t *in_R9;
  ushort uVar48;
  ulong uVar49;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar56;
  ushort uVar57;
  undefined1 auVar50 [16];
  ulong uVar55;
  ushort uVar58;
  undefined1 auVar59 [16];
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  __m128i d7;
  __m128i d6;
  __m128i d5;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i workp_b;
  __m128i workp_a;
  __m128i q [2];
  __m128i p_1 [2];
  __m128i qs [2];
  __m128i ps [2];
  __m128i ffff;
  __m128i one;
  __m128i four;
  __m128i zero;
  __m128i work2;
  __m128i work1;
  __m128i work0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i oq1;
  __m128i oq0;
  __m128i op0;
  __m128i op1;
  __m128i oq2;
  __m128i op2;
  __m128i work_a;
  __m128i flat;
  __m128i mask;
  __m128i t80;
  __m128i thresh0_1;
  __m128i limit0_1;
  __m128i blimit0_1;
  __m128i *in_stack_ffffffffffffea08;
  undefined4 in_stack_ffffffffffffea30;
  undefined2 in_stack_ffffffffffffea34;
  undefined2 uVar60;
  undefined2 in_stack_ffffffffffffea36;
  undefined2 uVar61;
  __m128i *in_stack_ffffffffffffea38;
  __m128i *t80_out;
  __m128i *in_stack_ffffffffffffea40;
  __m128i *thr_out;
  __m128i *in_stack_ffffffffffffea48;
  __m128i *in_stack_ffffffffffffea50;
  __m128i *in_stack_ffffffffffffea58;
  __m128i *in_stack_ffffffffffffea60;
  __m128i *in_stack_ffffffffffffea68;
  __m128i *in_stack_ffffffffffffea70;
  __m128i *in_stack_ffffffffffffea78;
  __m128i *in_stack_ffffffffffffea80;
  __m128i *in_stack_ffffffffffffea88;
  undefined1 local_1568 [16];
  undefined1 local_1558 [16];
  undefined1 local_1548 [16];
  longlong local_1538;
  longlong lStack_1530;
  longlong local_1528;
  longlong lStack_1520;
  longlong local_1518;
  longlong lStack_1510;
  longlong local_1508;
  longlong lStack_1500;
  longlong local_14f8;
  longlong lStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  uint8_t *local_14b8;
  uint8_t *local_14b0;
  uint8_t *local_14a8;
  uint8_t *local_14a0;
  int local_1494;
  undefined8 *local_1490;
  longlong *local_1388;
  longlong *local_1380;
  longlong *local_1378;
  longlong *local_1370;
  longlong *local_1368;
  undefined8 *local_1360;
  undefined8 *local_1358;
  undefined8 *local_1350;
  short local_1348;
  short sStack_1346;
  short sStack_1344;
  short sStack_1342;
  short sStack_1340;
  short sStack_133e;
  short sStack_133c;
  short sStack_133a;
  short local_1338;
  short sStack_1336;
  short sStack_1334;
  short sStack_1332;
  short sStack_1330;
  short sStack_132e;
  short sStack_132c;
  short sStack_132a;
  longlong local_1328;
  longlong lStack_1320;
  longlong local_1318;
  longlong lStack_1310;
  longlong local_1308;
  longlong lStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  ulong local_12e8;
  ulong uStack_12e0;
  ulong local_12d8;
  ulong uStack_12d0;
  ulong local_12c8;
  ulong uStack_12c0;
  ulong local_12b8;
  ulong uStack_12b0;
  undefined2 local_12a8;
  undefined2 uStack_12a6;
  undefined2 uStack_12a4;
  undefined2 uStack_12a2;
  undefined2 uStack_12a0;
  undefined2 uStack_129e;
  undefined2 uStack_129c;
  undefined2 uStack_129a;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  ushort local_1268;
  ushort uStack_1266;
  ushort uStack_1264;
  ushort uStack_1262;
  ushort uStack_1260;
  ushort uStack_125e;
  ushort uStack_125c;
  ushort uStack_125a;
  ushort local_1258;
  ushort uStack_1256;
  ushort uStack_1254;
  ushort uStack_1252;
  ushort uStack_1250;
  ushort uStack_124e;
  ushort uStack_124c;
  ushort uStack_124a;
  ushort local_1248;
  ushort uStack_1246;
  ushort uStack_1244;
  ushort uStack_1242;
  ushort uStack_1240;
  ushort uStack_123e;
  ushort uStack_123c;
  ushort uStack_123a;
  undefined1 local_1238 [16];
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  ushort local_11d8;
  ushort uStack_11d6;
  ushort uStack_11d4;
  ushort uStack_11d2;
  ushort uStack_11d0;
  ushort uStack_11ce;
  ushort uStack_11cc;
  ushort uStack_11ca;
  ushort local_11c8;
  ushort uStack_11c6;
  ushort uStack_11c4;
  ushort uStack_11c2;
  ushort uStack_11c0;
  ushort uStack_11be;
  ushort uStack_11bc;
  ushort uStack_11ba;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  longlong local_1188 [2];
  longlong local_1178 [2];
  longlong local_1168;
  longlong lStack_1160;
  longlong local_1158;
  longlong lStack_1150;
  int local_113c;
  uint8_t *local_1128;
  uint8_t *local_1120;
  uint8_t *local_1118;
  uint8_t *local_1110;
  __m128i *local_1108;
  __m128i *local_1100;
  __m128i *local_10f8;
  undefined1 (*local_10f0) [16];
  __m128i *local_10e8;
  undefined1 (*local_10e0) [16];
  __m128i *local_10d8;
  undefined1 (*local_10d0) [16];
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  ulong local_10b8;
  ulong uStack_10b0;
  ulong local_10a8;
  ulong uStack_10a0;
  ulong local_1098;
  ulong uStack_1090;
  ulong local_1088;
  ulong uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  ulong local_1068;
  ulong uStack_1060;
  ulong local_1058;
  ulong uStack_1050;
  ulong local_1048;
  ulong uStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  ulong local_1028;
  ulong uStack_1020;
  ulong local_1018;
  ulong uStack_1010;
  ulong local_1008;
  ulong uStack_1000;
  ulong local_ff8;
  ulong uStack_ff0;
  ulong local_fe8;
  ulong uStack_fe0;
  undefined1 local_fd8 [16];
  ulong local_fc8;
  ulong uStack_fc0;
  short local_fb8;
  short sStack_fb6;
  short sStack_fb4;
  short sStack_fb2;
  short sStack_fb0;
  short sStack_fae;
  short sStack_fac;
  ushort uStack_faa;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined2 local_efc;
  undefined2 local_efa;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  short local_ec8;
  short sStack_ec6;
  short sStack_ec4;
  short sStack_ec2;
  short sStack_ec0;
  short sStack_ebe;
  short sStack_ebc;
  short sStack_eba;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  short local_ea8;
  short sStack_ea6;
  short sStack_ea4;
  short sStack_ea2;
  short sStack_ea0;
  short sStack_e9e;
  short sStack_e9c;
  short sStack_e9a;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  short local_e68;
  short sStack_e66;
  short sStack_e64;
  short sStack_e62;
  short sStack_e60;
  short sStack_e5e;
  short sStack_e5c;
  short sStack_e5a;
  undefined8 local_e58;
  undefined8 uStack_e50;
  short local_e48;
  short sStack_e46;
  short sStack_e44;
  short sStack_e42;
  short sStack_e40;
  short sStack_e3e;
  short sStack_e3c;
  short sStack_e3a;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  short local_e08;
  short sStack_e06;
  short sStack_e04;
  short sStack_e02;
  short sStack_e00;
  short sStack_dfe;
  short sStack_dfc;
  short sStack_dfa;
  undefined8 local_df8;
  undefined8 uStack_df0;
  short local_de8;
  short sStack_de6;
  short sStack_de4;
  short sStack_de2;
  short sStack_de0;
  short sStack_dde;
  short sStack_ddc;
  short sStack_dda;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  short local_da8;
  short sStack_da6;
  short sStack_da4;
  short sStack_da2;
  short sStack_da0;
  short sStack_d9e;
  short sStack_d9c;
  short sStack_d9a;
  undefined8 local_d98;
  undefined8 uStack_d90;
  short local_d88;
  short sStack_d86;
  short sStack_d84;
  short sStack_d82;
  short sStack_d80;
  short sStack_d7e;
  short sStack_d7c;
  short sStack_d7a;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  short local_d48;
  short sStack_d46;
  short sStack_d44;
  short sStack_d42;
  short sStack_d40;
  short sStack_d3e;
  short sStack_d3c;
  short sStack_d3a;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  short local_ce8;
  short sStack_ce6;
  short sStack_ce4;
  short sStack_ce2;
  short sStack_ce0;
  short sStack_cde;
  short sStack_cdc;
  short sStack_cda;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  short local_ca8;
  short sStack_ca6;
  short sStack_ca4;
  short sStack_ca2;
  short sStack_ca0;
  short sStack_c9e;
  short sStack_c9c;
  short sStack_c9a;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  int in_stack_fffffffffffff380;
  undefined2 in_stack_fffffffffffff388;
  undefined2 in_stack_fffffffffffff38a;
  undefined2 in_stack_fffffffffffff38c;
  undefined2 in_stack_fffffffffffff38e;
  short local_c58;
  short sStack_c56;
  short sStack_c54;
  short sStack_c52;
  short sStack_c50;
  short sStack_c4e;
  short sStack_c4c;
  short sStack_c4a;
  short local_c48;
  short sStack_c46;
  short sStack_c44;
  short sStack_c42;
  short sStack_c40;
  short sStack_c3e;
  short sStack_c3c;
  short sStack_c3a;
  short local_c28;
  short sStack_c26;
  short sStack_c24;
  short sStack_c22;
  short sStack_c20;
  short sStack_c1e;
  short sStack_c1c;
  short sStack_c1a;
  short local_c18;
  short sStack_c16;
  short sStack_c14;
  short sStack_c12;
  short sStack_c10;
  short sStack_c0e;
  short sStack_c0c;
  short sStack_c0a;
  short local_bf8;
  short sStack_bf6;
  short sStack_bf4;
  short sStack_bf2;
  short sStack_bf0;
  short sStack_bee;
  short sStack_bec;
  short sStack_bea;
  short local_bd8;
  short sStack_bd6;
  short sStack_bd4;
  short sStack_bd2;
  short sStack_bd0;
  short sStack_bce;
  short sStack_bcc;
  short sStack_bca;
  short local_bb8;
  short sStack_bb6;
  short sStack_bb4;
  short sStack_bb2;
  short sStack_bb0;
  short sStack_bae;
  short sStack_bac;
  short sStack_baa;
  short local_b98;
  short sStack_b96;
  short sStack_b94;
  short sStack_b92;
  short sStack_b90;
  short sStack_b8e;
  short sStack_b8c;
  short sStack_b8a;
  short local_b78;
  short sStack_b76;
  short sStack_b74;
  short sStack_b72;
  short sStack_b70;
  short sStack_b6e;
  short sStack_b6c;
  short sStack_b6a;
  short local_b58;
  short sStack_b56;
  short sStack_b54;
  short sStack_b52;
  short sStack_b50;
  short sStack_b4e;
  short sStack_b4c;
  short sStack_b4a;
  short local_b38;
  short sStack_b36;
  short sStack_b34;
  short sStack_b32;
  short sStack_b30;
  short sStack_b2e;
  short sStack_b2c;
  short sStack_b2a;
  ushort local_a48;
  ushort uStack_a46;
  ushort uStack_a44;
  ushort uStack_a42;
  ushort uStack_a40;
  ushort uStack_a3e;
  ushort uStack_a3c;
  ushort uStack_a3a;
  uint local_a38;
  uint uStack_a34;
  uint uStack_a30;
  uint uStack_a2c;
  uint local_a28;
  uint uStack_a24;
  uint uStack_a20;
  uint uStack_a1c;
  ulong local_878;
  ulong uStack_870;
  ulong local_868;
  ulong uStack_860;
  ulong local_838;
  ulong uStack_830;
  ulong local_828;
  ulong uStack_820;
  ulong local_7f8;
  ulong uStack_7f0;
  ulong local_7e8;
  ulong uStack_7e0;
  ulong local_7b8;
  ulong uStack_7b0;
  ulong local_7a8;
  ulong uStack_7a0;
  ulong local_778;
  ulong uStack_770;
  ulong local_768;
  ulong uStack_760;
  ulong local_738;
  ulong uStack_730;
  ulong local_728;
  ulong uStack_720;
  ulong local_6f8;
  ulong uStack_6f0;
  ulong local_6e8;
  ulong uStack_6e0;
  ulong local_6b8;
  ulong uStack_6b0;
  ulong local_6a8;
  ulong uStack_6a0;
  ulong local_678;
  ulong uStack_670;
  ulong local_668;
  ulong uStack_660;
  ulong local_638;
  ulong uStack_630;
  ulong local_628;
  ulong uStack_620;
  ulong local_5f8;
  ulong uStack_5f0;
  ulong local_5e8;
  ulong uStack_5e0;
  ulong local_5b8;
  ulong uStack_5b0;
  ulong local_5a8;
  ulong uStack_5a0;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  
  local_1350 = in_RDI + -1;
  local_14c8 = *local_1350;
  uStack_14c0 = *in_RDI;
  local_1358 = (undefined8 *)((long)in_RDI + (long)in_ESI * 2 + -8);
  local_14d8 = *local_1358;
  uStack_14d0 = local_1358[1];
  local_1360 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * 2 + -8);
  local_14e8 = *local_1360;
  uStack_14e0 = local_1360[1];
  local_1368 = (longlong *)((long)in_RDI + (long)(in_ESI * 3) * 2 + -8);
  local_14f8 = *local_1368;
  lStack_14f0 = local_1368[1];
  local_1370 = (longlong *)((long)in_RDI + (long)(in_ESI << 2) * 2 + -8);
  local_1508 = *local_1370;
  lStack_1500 = local_1370[1];
  local_1378 = (longlong *)((long)in_RDI + (long)(in_ESI * 5) * 2 + -8);
  local_1518 = *local_1378;
  lStack_1510 = local_1378[1];
  local_1380 = (longlong *)((long)in_RDI + (long)(in_ESI * 6) * 2 + -8);
  local_1528 = *local_1380;
  lStack_1520 = local_1380[1];
  local_1388 = (longlong *)((long)in_RDI + (long)(in_ESI * 7) * 2 + -8);
  local_1538 = *local_1388;
  lStack_1530 = local_1388[1];
  local_14b8 = in_R9;
  local_14b0 = in_R8;
  local_14a8 = in_RCX;
  local_14a0 = in_RDX;
  local_1494 = in_ESI;
  local_1490 = in_RDI;
  highbd_transpose8x8_sse2
            (in_stack_ffffffffffffea08,(__m128i *)&stack0xffffffffffffea48,
             (__m128i *)&stack0xffffffffffffea58,(__m128i *)&stack0xffffffffffffea68,
             (__m128i *)&stack0xffffffffffffea78,(__m128i *)&stack0xffffffffffffea88,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffea36,
                      CONCAT24(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30)),
             in_stack_ffffffffffffea38,in_stack_ffffffffffffea40,in_stack_ffffffffffffea48,
             in_stack_ffffffffffffea50,in_stack_ffffffffffffea58,in_stack_ffffffffffffea60,
             in_stack_ffffffffffffea68,in_stack_ffffffffffffea70,in_stack_ffffffffffffea78);
  local_1110 = local_14a0;
  local_1118 = local_14a8;
  local_1120 = local_14b0;
  local_1128 = local_14b8;
  local_113c = in_stack_00000018;
  local_10c8 = 0;
  uStack_10c0 = 0;
  local_1278 = 0;
  uStack_1270 = 0;
  local_efa = 4;
  uVar60 = 4;
  local_1288 = 0x4000400040004;
  uStack_1280 = 0x4000400040004;
  local_efc = 1;
  uVar61 = 1;
  local_1298 = 0x1000100010001;
  uStack_1290 = 0x1000100010001;
  local_12a8 = 0xffff;
  uStack_12a6 = 0xffff;
  uStack_12a4 = 0xffff;
  uStack_12a2 = 0xffff;
  uStack_12a0 = 0xffff;
  uStack_129e = 0xffff;
  uStack_129c = 0xffff;
  uStack_129a = 0xffff;
  t80_out = &local_1188;
  thr_out = &local_1178;
  local_1108 = (__m128i *)&stack0xffffffffffffea78;
  local_1100 = (__m128i *)&stack0xffffffffffffea88;
  local_10f8 = (__m128i *)&stack0xffffffffffffea68;
  local_10f0 = &local_1568;
  local_10e8 = (__m128i *)&stack0xffffffffffffea58;
  local_10e0 = &local_1558;
  local_10d8 = (__m128i *)&stack0xffffffffffffea48;
  local_10d0 = &local_1548;
  local_f28 = local_1298;
  uStack_f20 = uStack_1290;
  local_f18 = local_1298;
  uStack_f10 = uStack_1290;
  get_limit_dual(local_14a0,local_14a8,local_14b0,local_14b8,in_stack_00000008,in_stack_00000010,
                 in_stack_00000018,(__m128i *)&local_1158,(__m128i *)&local_1168,thr_out,t80_out);
  auVar59 = psubusw((undefined1  [16])*local_1100,(undefined1  [16])*local_1108);
  auVar50 = psubusw((undefined1  [16])*local_1108,(undefined1  [16])*local_1100);
  local_5a8 = auVar59._0_8_;
  uStack_5a0 = auVar59._8_8_;
  local_5b8 = auVar50._0_8_;
  uStack_5b0 = auVar50._8_8_;
  auVar59 = psubusw(*local_10f0,(undefined1  [16])*local_10f8);
  auVar50 = psubusw((undefined1  [16])*local_10f8,*local_10f0);
  local_5e8 = auVar59._0_8_;
  uStack_5e0 = auVar59._8_8_;
  local_5f8 = auVar50._0_8_;
  uStack_5f0 = auVar50._8_8_;
  local_5e8 = local_5e8 | local_5f8;
  uStack_5e0 = uStack_5e0 | uStack_5f0;
  auVar37._8_8_ = uStack_5a0 | uStack_5b0;
  auVar37._0_8_ = local_5a8 | local_5b8;
  auVar36._8_8_ = uStack_5a0 | uStack_5b0;
  auVar36._0_8_ = local_5a8 | local_5b8;
  local_1238 = paddusw(auVar37,auVar36);
  local_a48 = (ushort)local_5e8;
  uStack_a46 = (ushort)(local_5e8 >> 0x10);
  uStack_a44 = (ushort)(local_5e8 >> 0x20);
  uStack_a40 = (ushort)uStack_5e0;
  uStack_a3e = (ushort)(uStack_5e0 >> 0x10);
  uStack_a3c = (ushort)(uStack_5e0 >> 0x20);
  local_1228 = CONCAT26((ushort)(local_5e8 >> 0x31),
                        CONCAT24(uStack_a44 >> 1,CONCAT22(uStack_a46 >> 1,local_a48 >> 1)));
  uStack_1220 = CONCAT26((ushort)(uStack_5e0 >> 0x31),
                         CONCAT24(uStack_a3c >> 1,CONCAT22(uStack_a3e >> 1,uStack_a40 >> 1)));
  auVar35._8_8_ = uStack_1220;
  auVar35._0_8_ = local_1228;
  auVar50 = paddusw(local_1238,auVar35);
  auVar41._8_8_ = lStack_1150;
  auVar41._0_8_ = local_1158;
  auVar50 = psubusw(auVar50,auVar41);
  local_1198 = auVar50._0_8_;
  uStack_1190 = auVar50._8_8_;
  local_f38 = local_1198;
  uVar13 = local_f38;
  uStack_f30 = uStack_1190;
  uVar14 = uStack_f30;
  local_f48 = local_1278;
  uVar3 = local_f48;
  uStack_f40 = uStack_1270;
  uVar4 = uStack_f40;
  local_f38._0_2_ = auVar50._0_2_;
  local_f38._2_2_ = auVar50._2_2_;
  local_f38._4_2_ = auVar50._4_2_;
  local_f38._6_2_ = auVar50._6_2_;
  uStack_f30._0_2_ = auVar50._8_2_;
  uStack_f30._2_2_ = auVar50._10_2_;
  uStack_f30._4_2_ = auVar50._12_2_;
  uStack_f30._6_2_ = auVar50._14_2_;
  local_f48._0_2_ = (short)local_1278;
  local_f48._2_2_ = (short)((ulong)local_1278 >> 0x10);
  local_f48._4_2_ = (short)((ulong)local_1278 >> 0x20);
  local_f48._6_2_ = (short)((ulong)local_1278 >> 0x30);
  uStack_f40._0_2_ = (short)uStack_1270;
  uStack_f40._2_2_ = (short)((ulong)uStack_1270 >> 0x10);
  uStack_f40._4_2_ = (short)((ulong)uStack_1270 >> 0x20);
  uStack_f40._6_2_ = (short)((ulong)uStack_1270 >> 0x30);
  local_fc8 = CONCAT26(-(ushort)(local_f38._6_2_ == local_f48._6_2_),
                       CONCAT24(-(ushort)(local_f38._4_2_ == local_f48._4_2_),
                                CONCAT22(-(ushort)(local_f38._2_2_ == local_f48._2_2_),
                                         -(ushort)((short)local_f38 == (short)local_f48)))) ^
              CONCAT26(uStack_12a2,CONCAT24(uStack_12a4,CONCAT22(uStack_12a6,local_12a8)));
  uStack_fc0 = CONCAT26(-(ushort)(uStack_f30._6_2_ == uStack_f40._6_2_),
                        CONCAT24(-(ushort)(uStack_f30._4_2_ == uStack_f40._4_2_),
                                 CONCAT22(-(ushort)(uStack_f30._2_2_ == uStack_f40._2_2_),
                                          -(ushort)((short)uStack_f30 == (short)uStack_f40)))) ^
               CONCAT26(uStack_129a,CONCAT24(uStack_129c,CONCAT22(uStack_129e,uStack_12a0)));
  auVar34._8_8_ = lStack_1160;
  auVar34._0_8_ = local_1168;
  auVar33._8_8_ = uStack_1290;
  auVar33._0_8_ = local_1298;
  local_fd8 = paddusw(auVar34,auVar33);
  uVar49 = local_fc8 & local_fd8._0_8_;
  uVar55 = uStack_fc0 & local_fd8._8_8_;
  auVar59 = psubusw(*local_10d0,*local_10e0);
  auVar50 = psubusw(*local_10e0,*local_10d0);
  local_628 = auVar59._0_8_;
  uStack_620 = auVar59._8_8_;
  local_638 = auVar50._0_8_;
  uStack_630 = auVar50._8_8_;
  local_628 = local_628 | local_638;
  uStack_620 = uStack_620 | uStack_630;
  auVar59 = psubusw(*local_10e0,*local_10f0);
  auVar50 = psubusw(*local_10f0,*local_10e0);
  local_668 = auVar59._0_8_;
  uStack_660 = auVar59._8_8_;
  local_678 = auVar50._0_8_;
  uStack_670 = auVar50._8_8_;
  local_668 = local_668 | local_678;
  uStack_660 = uStack_660 | uStack_670;
  local_88 = (short)local_628;
  sStack_86 = (short)(local_628 >> 0x10);
  sStack_84 = (short)(local_628 >> 0x20);
  sStack_82 = (short)(local_628 >> 0x30);
  sStack_80 = (short)uStack_620;
  sStack_7e = (short)(uStack_620 >> 0x10);
  sStack_7c = (short)(uStack_620 >> 0x20);
  sStack_7a = (short)(uStack_620 >> 0x30);
  local_98 = (short)local_668;
  sStack_96 = (short)(local_668 >> 0x10);
  sStack_94 = (short)(local_668 >> 0x20);
  sStack_92 = (short)(local_668 >> 0x30);
  sStack_90 = (short)uStack_660;
  sStack_8e = (short)(uStack_660 >> 0x10);
  sStack_8c = (short)(uStack_660 >> 0x20);
  sStack_8a = (short)(uStack_660 >> 0x30);
  uVar48 = (ushort)(local_88 < local_98) * local_98 | (ushort)(local_88 >= local_98) * local_88;
  uVar51 = (ushort)(sStack_86 < sStack_96) * sStack_96 |
           (ushort)(sStack_86 >= sStack_96) * sStack_86;
  uVar52 = (ushort)(sStack_84 < sStack_94) * sStack_94 |
           (ushort)(sStack_84 >= sStack_94) * sStack_84;
  uVar53 = (ushort)(sStack_82 < sStack_92) * sStack_92 |
           (ushort)(sStack_82 >= sStack_92) * sStack_82;
  uVar54 = (ushort)(sStack_80 < sStack_90) * sStack_90 |
           (ushort)(sStack_80 >= sStack_90) * sStack_80;
  uVar56 = (ushort)(sStack_7e < sStack_8e) * sStack_8e |
           (ushort)(sStack_7e >= sStack_8e) * sStack_7e;
  uVar57 = (ushort)(sStack_7c < sStack_8c) * sStack_8c |
           (ushort)(sStack_7c >= sStack_8c) * sStack_7c;
  uVar58 = (ushort)(sStack_7a < sStack_8a) * sStack_8a |
           (ushort)(sStack_7a >= sStack_8a) * sStack_7a;
  auVar59 = psubusw(*local_10f0,(undefined1  [16])*local_1100);
  auVar50 = psubusw((undefined1  [16])*local_1100,*local_10f0);
  local_6a8 = auVar59._0_8_;
  uStack_6a0 = auVar59._8_8_;
  local_6b8 = auVar50._0_8_;
  uStack_6b0 = auVar50._8_8_;
  local_6a8 = local_6a8 | local_6b8;
  uStack_6a0 = uStack_6a0 | uStack_6b0;
  auVar59 = psubusw((undefined1  [16])*local_10f8,(undefined1  [16])*local_1108);
  auVar50 = psubusw((undefined1  [16])*local_1108,(undefined1  [16])*local_10f8);
  local_6e8 = auVar59._0_8_;
  uStack_6e0 = auVar59._8_8_;
  local_6f8 = auVar50._0_8_;
  uStack_6f0 = auVar50._8_8_;
  local_6e8 = local_6e8 | local_6f8;
  uStack_6e0 = uStack_6e0 | uStack_6f0;
  local_a8 = (short)local_6a8;
  sStack_a6 = (short)(local_6a8 >> 0x10);
  sStack_a4 = (short)(local_6a8 >> 0x20);
  sStack_a2 = (short)(local_6a8 >> 0x30);
  sStack_a0 = (short)uStack_6a0;
  sStack_9e = (short)(uStack_6a0 >> 0x10);
  sStack_9c = (short)(uStack_6a0 >> 0x20);
  sStack_9a = (short)(uStack_6a0 >> 0x30);
  local_b8 = (short)local_6e8;
  sStack_b6 = (short)(local_6e8 >> 0x10);
  sStack_b4 = (short)(local_6e8 >> 0x20);
  sStack_b2 = (short)(local_6e8 >> 0x30);
  sStack_b0 = (short)uStack_6e0;
  sStack_ae = (short)(uStack_6e0 >> 0x10);
  sStack_ac = (short)(uStack_6e0 >> 0x20);
  sStack_aa = (short)(uStack_6e0 >> 0x30);
  local_1258 = (ushort)(local_a8 < local_b8) * local_b8 | (ushort)(local_a8 >= local_b8) * local_a8;
  uStack_1256 = (ushort)(sStack_a6 < sStack_b6) * sStack_b6 |
                (ushort)(sStack_a6 >= sStack_b6) * sStack_a6;
  uStack_1254 = (ushort)(sStack_a4 < sStack_b4) * sStack_b4 |
                (ushort)(sStack_a4 >= sStack_b4) * sStack_a4;
  uStack_1252 = (ushort)(sStack_a2 < sStack_b2) * sStack_b2 |
                (ushort)(sStack_a2 >= sStack_b2) * sStack_a2;
  uStack_1250 = (ushort)(sStack_a0 < sStack_b0) * sStack_b0 |
                (ushort)(sStack_a0 >= sStack_b0) * sStack_a0;
  uStack_124e = (ushort)(sStack_9e < sStack_ae) * sStack_ae |
                (ushort)(sStack_9e >= sStack_ae) * sStack_9e;
  uStack_124c = (ushort)(sStack_9c < sStack_ac) * sStack_ac |
                (ushort)(sStack_9c >= sStack_ac) * sStack_9c;
  uStack_124a = (ushort)(sStack_9a < sStack_aa) * sStack_aa |
                (ushort)(sStack_9a >= sStack_aa) * sStack_9a;
  local_1248 = ((short)uVar48 < (short)local_1258) * local_1258 |
               ((short)uVar48 >= (short)local_1258) * uVar48;
  uStack_1246 = ((short)uVar51 < (short)uStack_1256) * uStack_1256 |
                ((short)uVar51 >= (short)uStack_1256) * uVar51;
  uStack_1244 = ((short)uVar52 < (short)uStack_1254) * uStack_1254 |
                ((short)uVar52 >= (short)uStack_1254) * uVar52;
  uStack_1242 = ((short)uVar53 < (short)uStack_1252) * uStack_1252 |
                ((short)uVar53 >= (short)uStack_1252) * uVar53;
  uStack_1240 = ((short)uVar54 < (short)uStack_1250) * uStack_1250 |
                ((short)uVar54 >= (short)uStack_1250) * uVar54;
  uStack_123e = ((short)uVar56 < (short)uStack_124e) * uStack_124e |
                ((short)uVar56 >= (short)uStack_124e) * uVar56;
  uStack_123c = ((short)uVar57 < (short)uStack_124c) * uStack_124c |
                ((short)uVar57 >= (short)uStack_124c) * uVar57;
  uStack_123a = ((short)uVar58 < (short)uStack_124a) * uStack_124a |
                ((short)uVar58 >= (short)uStack_124a) * uVar58;
  auVar59 = psubusw((undefined1  [16])*local_10e8,(undefined1  [16])*local_10f8);
  auVar50 = psubusw((undefined1  [16])*local_10f8,(undefined1  [16])*local_10e8);
  local_728 = auVar59._0_8_;
  uStack_720 = auVar59._8_8_;
  local_738 = auVar50._0_8_;
  uStack_730 = auVar50._8_8_;
  local_728 = local_728 | local_738;
  uStack_720 = uStack_720 | uStack_730;
  auVar59 = psubusw((undefined1  [16])*local_10e8,(undefined1  [16])*local_10d8);
  auVar50 = psubusw((undefined1  [16])*local_10d8,(undefined1  [16])*local_10e8);
  local_768 = auVar59._0_8_;
  uStack_760 = auVar59._8_8_;
  local_778 = auVar50._0_8_;
  uStack_770 = auVar50._8_8_;
  local_768 = local_768 | local_778;
  uStack_760 = uStack_760 | uStack_770;
  local_e8 = (short)local_728;
  sStack_e6 = (short)(local_728 >> 0x10);
  sStack_e4 = (short)(local_728 >> 0x20);
  sStack_e2 = (short)(local_728 >> 0x30);
  sStack_e0 = (short)uStack_720;
  sStack_de = (short)(uStack_720 >> 0x10);
  sStack_dc = (short)(uStack_720 >> 0x20);
  sStack_da = (short)(uStack_720 >> 0x30);
  local_f8 = (short)local_768;
  sStack_f6 = (short)(local_768 >> 0x10);
  sStack_f4 = (short)(local_768 >> 0x20);
  sStack_f2 = (short)(local_768 >> 0x30);
  sStack_f0 = (short)uStack_760;
  sStack_ee = (short)(uStack_760 >> 0x10);
  sStack_ec = (short)(uStack_760 >> 0x20);
  sStack_ea = (short)(uStack_760 >> 0x30);
  uVar48 = (ushort)(local_e8 < local_f8) * local_f8 | (ushort)(local_e8 >= local_f8) * local_e8;
  uVar51 = (ushort)(sStack_e6 < sStack_f6) * sStack_f6 |
           (ushort)(sStack_e6 >= sStack_f6) * sStack_e6;
  uVar52 = (ushort)(sStack_e4 < sStack_f4) * sStack_f4 |
           (ushort)(sStack_e4 >= sStack_f4) * sStack_e4;
  uVar53 = (ushort)(sStack_e2 < sStack_f2) * sStack_f2 |
           (ushort)(sStack_e2 >= sStack_f2) * sStack_e2;
  uVar54 = (ushort)(sStack_e0 < sStack_f0) * sStack_f0 |
           (ushort)(sStack_e0 >= sStack_f0) * sStack_e0;
  uVar56 = (ushort)(sStack_de < sStack_ee) * sStack_ee |
           (ushort)(sStack_de >= sStack_ee) * sStack_de;
  uVar57 = (ushort)(sStack_dc < sStack_ec) * sStack_ec |
           (ushort)(sStack_dc >= sStack_ec) * sStack_dc;
  uVar58 = (ushort)(sStack_da < sStack_ea) * sStack_ea |
           (ushort)(sStack_da >= sStack_ea) * sStack_da;
  local_1268 = ((short)uVar48 < (short)local_1248) * local_1248 |
               ((short)uVar48 >= (short)local_1248) * uVar48;
  uStack_1266 = ((short)uVar51 < (short)uStack_1246) * uStack_1246 |
                ((short)uVar51 >= (short)uStack_1246) * uVar51;
  uStack_1264 = ((short)uVar52 < (short)uStack_1244) * uStack_1244 |
                ((short)uVar52 >= (short)uStack_1244) * uVar52;
  uStack_1262 = ((short)uVar53 < (short)uStack_1242) * uStack_1242 |
                ((short)uVar53 >= (short)uStack_1242) * uVar53;
  uStack_1260 = ((short)uVar54 < (short)uStack_1240) * uStack_1240 |
                ((short)uVar54 >= (short)uStack_1240) * uVar54;
  uStack_125e = ((short)uVar56 < (short)uStack_123e) * uStack_123e |
                ((short)uVar56 >= (short)uStack_123e) * uVar56;
  uStack_125c = ((short)uVar57 < (short)uStack_123c) * uStack_123c |
                ((short)uVar57 >= (short)uStack_123c) * uVar57;
  uStack_125a = ((short)uVar58 < (short)uStack_123a) * uStack_123a |
                ((short)uVar58 >= (short)uStack_123a) * uVar58;
  local_138 = (short)uVar49;
  sStack_136 = (short)(uVar49 >> 0x10);
  sStack_134 = (short)(uVar49 >> 0x20);
  sStack_132 = (short)(uVar49 >> 0x30);
  sStack_130 = (short)uVar55;
  sStack_12e = (short)(uVar55 >> 0x10);
  sStack_12c = (short)(uVar55 >> 0x20);
  sStack_12a = (short)(uVar55 >> 0x30);
  local_1198._0_4_ =
       CONCAT22((ushort)((short)uStack_1266 < sStack_136) * sStack_136 |
                ((short)uStack_1266 >= sStack_136) * uStack_1266,
                (ushort)((short)local_1268 < local_138) * local_138 |
                ((short)local_1268 >= local_138) * local_1268);
  local_1198._0_6_ =
       CONCAT24((ushort)((short)uStack_1264 < sStack_134) * sStack_134 |
                ((short)uStack_1264 >= sStack_134) * uStack_1264,(undefined4)local_1198);
  local_1198 = CONCAT26((ushort)((short)uStack_1262 < sStack_132) * sStack_132 |
                        ((short)uStack_1262 >= sStack_132) * uStack_1262,(undefined6)local_1198);
  uStack_1190._0_2_ =
       (ushort)((short)uStack_1260 < sStack_130) * sStack_130 |
       ((short)uStack_1260 >= sStack_130) * uStack_1260;
  uStack_1190._2_2_ =
       (ushort)((short)uStack_125e < sStack_12e) * sStack_12e |
       ((short)uStack_125e >= sStack_12e) * uStack_125e;
  uStack_1190._4_2_ =
       (ushort)((short)uStack_125c < sStack_12c) * sStack_12c |
       ((short)uStack_125c >= sStack_12c) * uStack_125c;
  uStack_1190._6_2_ =
       (ushort)((short)uStack_125a < sStack_12a) * sStack_12a |
       ((short)uStack_125a >= sStack_12a) * uStack_125a;
  auVar40._8_8_ = uStack_1190;
  auVar40._0_8_ = local_1198;
  auVar39._8_8_ = lStack_1160;
  auVar39._0_8_ = local_1168;
  auVar50 = psubusw(auVar40,auVar39);
  local_1198 = auVar50._0_8_;
  uStack_1190 = auVar50._8_8_;
  local_f58 = local_1198;
  uVar1 = local_f58;
  uStack_f50 = uStack_1190;
  uVar2 = uStack_f50;
  local_f68 = local_1278;
  uStack_f60 = uStack_1270;
  local_f58._0_2_ = auVar50._0_2_;
  local_f58._2_2_ = auVar50._2_2_;
  local_f58._4_2_ = auVar50._4_2_;
  local_f58._6_2_ = auVar50._6_2_;
  uStack_f50._0_2_ = auVar50._8_2_;
  uStack_f50._2_2_ = auVar50._10_2_;
  uStack_f50._4_2_ = auVar50._12_2_;
  uStack_f50._6_2_ = auVar50._14_2_;
  local_1198._2_2_ = -(ushort)(local_f58._2_2_ == local_f48._2_2_);
  local_1198._0_2_ = -(ushort)((short)local_f58 == (short)local_f48);
  local_1198._4_2_ = -(ushort)(local_f58._4_2_ == local_f48._4_2_);
  local_1198._6_2_ = -(ushort)(local_f58._6_2_ == local_f48._6_2_);
  uStack_1190._0_2_ = -(ushort)((short)uStack_f50 == (short)uStack_f40);
  uStack_1190._2_2_ = -(ushort)(uStack_f50._2_2_ == uStack_f40._2_2_);
  uStack_1190._4_2_ = -(ushort)(uStack_f50._4_2_ == uStack_f40._4_2_);
  uStack_1190._6_2_ = -(ushort)(uStack_f50._6_2_ == uStack_f40._6_2_);
  local_1308 = (*local_1100)[0];
  lStack_1300 = (*local_1100)[1];
  local_12f8 = *(undefined8 *)*local_10f0;
  uStack_12f0 = *(undefined8 *)(*local_10f0 + 8);
  local_1328 = (*local_1108)[0];
  lStack_1320 = (*local_1108)[1];
  local_1318 = (*local_10f8)[0];
  lStack_1310 = (*local_10f8)[1];
  local_f58 = uVar1;
  uStack_f50 = uVar2;
  local_f48 = uVar3;
  uStack_f40 = uVar4;
  local_f38 = uVar13;
  uStack_f30 = uVar14;
  highbd_filter4_dual_sse2
            (in_stack_ffffffffffffea88,in_stack_ffffffffffffea80,in_stack_ffffffffffffea78,
             in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
             in_stack_fffffffffffff380,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffff38e,
                      CONCAT24(in_stack_fffffffffffff38c,
                               CONCAT22(in_stack_fffffffffffff38a,in_stack_fffffffffffff388))));
  palVar42 = local_1108;
  uVar49 = uStack_12e0;
  auVar59 = psubusw(*local_10e0,(undefined1  [16])*local_1100);
  auVar50 = psubusw((undefined1  [16])*local_1100,*local_10e0);
  local_7a8 = auVar59._0_8_;
  uStack_7a0 = auVar59._8_8_;
  local_7b8 = auVar50._0_8_;
  uStack_7b0 = auVar50._8_8_;
  local_7a8 = local_7a8 | local_7b8;
  uStack_7a0 = uStack_7a0 | uStack_7b0;
  auVar59 = psubusw((undefined1  [16])*local_10e8,(undefined1  [16])*local_1108);
  auVar50 = psubusw((undefined1  [16])*local_1108,(undefined1  [16])*local_10e8);
  local_7e8 = auVar59._0_8_;
  uStack_7e0 = auVar59._8_8_;
  local_7f8 = auVar50._0_8_;
  uStack_7f0 = auVar50._8_8_;
  local_7e8 = local_7e8 | local_7f8;
  uStack_7e0 = uStack_7e0 | uStack_7f0;
  local_148 = (short)local_7a8;
  sStack_146 = (short)(local_7a8 >> 0x10);
  sStack_144 = (short)(local_7a8 >> 0x20);
  sStack_142 = (short)(local_7a8 >> 0x30);
  sStack_140 = (short)uStack_7a0;
  sStack_13e = (short)(uStack_7a0 >> 0x10);
  sStack_13c = (short)(uStack_7a0 >> 0x20);
  sStack_13a = (short)(uStack_7a0 >> 0x30);
  local_158 = (short)local_7e8;
  sStack_156 = (short)(local_7e8 >> 0x10);
  sStack_154 = (short)(local_7e8 >> 0x20);
  sStack_152 = (short)(local_7e8 >> 0x30);
  sStack_150 = (short)uStack_7e0;
  sStack_14e = (short)(uStack_7e0 >> 0x10);
  sStack_14c = (short)(uStack_7e0 >> 0x20);
  sStack_14a = (short)(uStack_7e0 >> 0x30);
  uVar48 = (ushort)(local_148 < local_158) * local_158 |
           (ushort)(local_148 >= local_158) * local_148;
  uVar51 = (ushort)(sStack_146 < sStack_156) * sStack_156 |
           (ushort)(sStack_146 >= sStack_156) * sStack_146;
  uVar52 = (ushort)(sStack_144 < sStack_154) * sStack_154 |
           (ushort)(sStack_144 >= sStack_154) * sStack_144;
  uVar53 = (ushort)(sStack_142 < sStack_152) * sStack_152 |
           (ushort)(sStack_142 >= sStack_152) * sStack_142;
  uVar54 = (ushort)(sStack_140 < sStack_150) * sStack_150 |
           (ushort)(sStack_140 >= sStack_150) * sStack_140;
  uVar56 = (ushort)(sStack_13e < sStack_14e) * sStack_14e |
           (ushort)(sStack_13e >= sStack_14e) * sStack_13e;
  uVar57 = (ushort)(sStack_13c < sStack_14c) * sStack_14c |
           (ushort)(sStack_13c >= sStack_14c) * sStack_13c;
  uVar58 = (ushort)(sStack_13a < sStack_14a) * sStack_14a |
           (ushort)(sStack_13a >= sStack_14a) * sStack_13a;
  uVar48 = ((short)local_1258 < (short)uVar48) * uVar48 |
           ((short)local_1258 >= (short)uVar48) * local_1258;
  uVar51 = ((short)uStack_1256 < (short)uVar51) * uVar51 |
           ((short)uStack_1256 >= (short)uVar51) * uStack_1256;
  uVar52 = ((short)uStack_1254 < (short)uVar52) * uVar52 |
           ((short)uStack_1254 >= (short)uVar52) * uStack_1254;
  uVar53 = ((short)uStack_1252 < (short)uVar53) * uVar53 |
           ((short)uStack_1252 >= (short)uVar53) * uStack_1252;
  uVar54 = ((short)uStack_1250 < (short)uVar54) * uVar54 |
           ((short)uStack_1250 >= (short)uVar54) * uStack_1250;
  uVar56 = ((short)uStack_124e < (short)uVar56) * uVar56 |
           ((short)uStack_124e >= (short)uVar56) * uStack_124e;
  uVar57 = ((short)uStack_124c < (short)uVar57) * uVar57 |
           ((short)uStack_124c >= (short)uVar57) * uStack_124c;
  uVar58 = ((short)uStack_124a < (short)uVar58) * uVar58 |
           ((short)uStack_124a >= (short)uVar58) * uStack_124a;
  auVar59 = psubusw(*local_10d0,(undefined1  [16])*local_1100);
  auVar50 = psubusw((undefined1  [16])*local_1100,*local_10d0);
  local_828 = auVar59._0_8_;
  uStack_820 = auVar59._8_8_;
  local_838 = auVar50._0_8_;
  uStack_830 = auVar50._8_8_;
  local_828 = local_828 | local_838;
  uStack_820 = uStack_820 | uStack_830;
  auVar59 = psubusw((undefined1  [16])*local_10d8,(undefined1  [16])*local_1108);
  auVar50 = psubusw((undefined1  [16])*local_1108,(undefined1  [16])*local_10d8);
  local_868 = auVar59._0_8_;
  uStack_860 = auVar59._8_8_;
  local_878 = auVar50._0_8_;
  uStack_870 = auVar50._8_8_;
  local_868 = local_868 | local_878;
  uStack_860 = uStack_860 | uStack_870;
  local_188 = (short)local_828;
  sStack_186 = (short)(local_828 >> 0x10);
  sStack_184 = (short)(local_828 >> 0x20);
  sStack_182 = (short)(local_828 >> 0x30);
  sStack_180 = (short)uStack_820;
  sStack_17e = (short)(uStack_820 >> 0x10);
  sStack_17c = (short)(uStack_820 >> 0x20);
  sStack_17a = (short)(uStack_820 >> 0x30);
  local_198 = (short)local_868;
  sStack_196 = (short)(local_868 >> 0x10);
  sStack_194 = (short)(local_868 >> 0x20);
  sStack_192 = (short)(local_868 >> 0x30);
  sStack_190 = (short)uStack_860;
  sStack_18e = (short)(uStack_860 >> 0x10);
  sStack_18c = (short)(uStack_860 >> 0x20);
  sStack_18a = (short)(uStack_860 >> 0x30);
  local_1248 = (ushort)(local_188 < local_198) * local_198 |
               (ushort)(local_188 >= local_198) * local_188;
  uStack_1246 = (ushort)(sStack_186 < sStack_196) * sStack_196 |
                (ushort)(sStack_186 >= sStack_196) * sStack_186;
  uStack_1244 = (ushort)(sStack_184 < sStack_194) * sStack_194 |
                (ushort)(sStack_184 >= sStack_194) * sStack_184;
  uStack_1242 = (ushort)(sStack_182 < sStack_192) * sStack_192 |
                (ushort)(sStack_182 >= sStack_192) * sStack_182;
  uStack_1240 = (ushort)(sStack_180 < sStack_190) * sStack_190 |
                (ushort)(sStack_180 >= sStack_190) * sStack_180;
  uStack_123e = (ushort)(sStack_17e < sStack_18e) * sStack_18e |
                (ushort)(sStack_17e >= sStack_18e) * sStack_17e;
  uStack_123c = (ushort)(sStack_17c < sStack_18c) * sStack_18c |
                (ushort)(sStack_17c >= sStack_18c) * sStack_17c;
  uStack_123a = (ushort)(sStack_17a < sStack_18a) * sStack_18a |
                (ushort)(sStack_17a >= sStack_18a) * sStack_17a;
  local_11a8._0_4_ =
       CONCAT22(((short)uStack_1246 < (short)uVar51) * uVar51 |
                ((short)uStack_1246 >= (short)uVar51) * uStack_1246,
                ((short)local_1248 < (short)uVar48) * uVar48 |
                ((short)local_1248 >= (short)uVar48) * local_1248);
  local_11a8._0_6_ =
       CONCAT24(((short)uStack_1244 < (short)uVar52) * uVar52 |
                ((short)uStack_1244 >= (short)uVar52) * uStack_1244,(undefined4)local_11a8);
  local_11a8 = CONCAT26(((short)uStack_1242 < (short)uVar53) * uVar53 |
                        ((short)uStack_1242 >= (short)uVar53) * uStack_1242,(undefined6)local_11a8);
  uStack_11a0._0_2_ =
       ((short)uStack_1240 < (short)uVar54) * uVar54 |
       ((short)uStack_1240 >= (short)uVar54) * uStack_1240;
  uStack_11a0._2_2_ =
       ((short)uStack_123e < (short)uVar56) * uVar56 |
       ((short)uStack_123e >= (short)uVar56) * uStack_123e;
  uStack_11a0._4_2_ =
       ((short)uStack_123c < (short)uVar57) * uVar57 |
       ((short)uStack_123c >= (short)uVar57) * uStack_123c;
  uStack_11a0._6_2_ =
       ((short)uStack_123a < (short)uVar58) * uVar58 |
       ((short)uStack_123a >= (short)uVar58) * uStack_123a;
  auVar59._8_8_ = uStack_1290;
  auVar59._0_8_ = local_1298;
  auVar50 = psllw(auVar59,ZEXT416(local_113c - 8));
  auVar38._8_8_ = uStack_11a0;
  auVar38._0_8_ = local_11a8;
  auVar50 = psubusw(auVar38,auVar50);
  local_11a8 = auVar50._0_8_;
  uStack_11a0 = auVar50._8_8_;
  local_f78 = local_11a8;
  uVar3 = local_f78;
  uStack_f70 = uStack_11a0;
  uVar4 = uStack_f70;
  local_f88 = local_1278;
  uVar1 = local_f88;
  uStack_f80 = uStack_1270;
  uVar2 = uStack_f80;
  local_f78._0_2_ = auVar50._0_2_;
  local_f78._2_2_ = auVar50._2_2_;
  local_f78._4_2_ = auVar50._4_2_;
  local_f78._6_2_ = auVar50._6_2_;
  uStack_f70._0_2_ = auVar50._8_2_;
  uStack_f70._2_2_ = auVar50._10_2_;
  uStack_f70._4_2_ = auVar50._12_2_;
  uStack_f70._6_2_ = auVar50._14_2_;
  local_f88._0_2_ = (short)local_1278;
  local_f88._2_2_ = (short)((ulong)local_1278 >> 0x10);
  local_f88._4_2_ = (short)((ulong)local_1278 >> 0x20);
  local_f88._6_2_ = (short)((ulong)local_1278 >> 0x30);
  uStack_f80._0_2_ = (short)uStack_1270;
  uStack_f80._2_2_ = (short)((ulong)uStack_1270 >> 0x10);
  uStack_f80._4_2_ = (short)((ulong)uStack_1270 >> 0x20);
  uStack_f80._6_2_ = (short)((ulong)uStack_1270 >> 0x30);
  local_11a8._0_4_ =
       CONCAT22(-(ushort)(local_f78._2_2_ == local_f88._2_2_),
                -(ushort)((short)local_f78 == (short)local_f88));
  local_11a8._0_6_ = CONCAT24(-(ushort)(local_f78._4_2_ == local_f88._4_2_),(undefined4)local_11a8);
  local_11a8 = CONCAT26(-(ushort)(local_f78._6_2_ == local_f88._6_2_),(undefined6)local_11a8);
  uStack_11a0._0_2_ = -(ushort)((short)uStack_f70 == (short)uStack_f80);
  uStack_11a0._2_2_ = -(ushort)(uStack_f70._2_2_ == uStack_f80._2_2_);
  uStack_11a0._4_2_ = -(ushort)(uStack_f70._4_2_ == uStack_f80._4_2_);
  uStack_11a0._6_2_ = -(ushort)(uStack_f70._6_2_ == uStack_f80._6_2_);
  local_fe8 = local_11a8;
  uStack_fe0 = uStack_11a0;
  local_ff8 = local_1198;
  uStack_ff0 = uStack_1190;
  local_11a8 = local_11a8 & local_1198;
  uStack_11a0 = uStack_11a0 & uStack_1190;
  local_fa8 = local_1278;
  uStack_fa0 = uStack_1270;
  local_f98._0_2_ = (short)local_11a8;
  local_f98._2_2_ = (short)(local_11a8 >> 0x10);
  local_f98._4_2_ = (short)(local_11a8 >> 0x20);
  local_f98._6_2_ = (short)(local_11a8 >> 0x30);
  uStack_f90._0_2_ = (short)uStack_11a0;
  uStack_f90._2_2_ = (short)(uStack_11a0 >> 0x10);
  uStack_f90._4_2_ = (short)(uStack_11a0 >> 0x20);
  uStack_f90._6_2_ = (short)(uStack_11a0 >> 0x30);
  local_fb8 = -(ushort)((short)local_f98 == (short)local_f88);
  sStack_fb6 = -(ushort)(local_f98._2_2_ == local_f88._2_2_);
  sStack_fb4 = -(ushort)(local_f98._4_2_ == local_f88._4_2_);
  sStack_fb2 = -(ushort)(local_f98._6_2_ == local_f88._6_2_);
  sStack_fb0 = -(ushort)((short)uStack_f90 == (short)uStack_f80);
  sStack_fae = -(ushort)(uStack_f90._2_2_ == uStack_f80._2_2_);
  sStack_fac = -(ushort)(uStack_f90._4_2_ == uStack_f80._4_2_);
  uStack_faa = -(ushort)(uStack_f90._6_2_ == uStack_f80._6_2_);
  auVar50._2_2_ = sStack_fb6;
  auVar50._0_2_ = local_fb8;
  auVar50._4_2_ = sStack_fb4;
  auVar50._6_2_ = sStack_fb2;
  auVar50._8_2_ = sStack_fb0;
  auVar50._10_2_ = sStack_fae;
  auVar50._12_2_ = sStack_fac;
  auVar50._14_2_ = uStack_faa;
  local_f98 = local_11a8;
  uStack_f90 = uStack_11a0;
  local_f88 = uVar1;
  uStack_f80 = uVar2;
  local_f78 = uVar3;
  uStack_f70 = uVar4;
  if ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uStack_faa >> 7) & 1) << 0xe | uStack_faa & 0x8000) == 0xffff) {
    (*local_1108)[0] = local_12e8;
    (*palVar42)[1] = uVar49;
    palVar42 = local_10f8;
    uVar49 = uStack_12d0;
    (*local_10f8)[0] = local_12d8;
    (*palVar42)[1] = uVar49;
    palVar42 = local_1100;
    uVar49 = uStack_12c0;
    (*local_1100)[0] = local_12c8;
    (*palVar42)[1] = uVar49;
    pauVar43 = local_10f0;
    uVar49 = uStack_12b0;
    *(ulong *)*local_10f0 = local_12b8;
    *(ulong *)(*pauVar43 + 8) = uVar49;
  }
  else {
    uVar1 = *(undefined8 *)*local_10d0;
    uVar2 = *(undefined8 *)(*local_10d0 + 8);
    local_c28 = (short)uVar1;
    sStack_c26 = (short)((ulong)uVar1 >> 0x10);
    sStack_c24 = (short)((ulong)uVar1 >> 0x20);
    sStack_c22 = (short)((ulong)uVar1 >> 0x30);
    sStack_c20 = (short)uVar2;
    sStack_c1e = (short)((ulong)uVar2 >> 0x10);
    sStack_c1c = (short)((ulong)uVar2 >> 0x20);
    sStack_c1a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_10e0;
    uVar2 = *(undefined8 *)(*local_10e0 + 8);
    uVar3 = *(undefined8 *)*local_10f0;
    uVar4 = *(undefined8 *)(*local_10f0 + 8);
    local_c48 = (short)uVar1;
    sStack_c46 = (short)((ulong)uVar1 >> 0x10);
    sStack_c44 = (short)((ulong)uVar1 >> 0x20);
    sStack_c42 = (short)((ulong)uVar1 >> 0x30);
    sStack_c40 = (short)uVar2;
    sStack_c3e = (short)((ulong)uVar2 >> 0x10);
    sStack_c3c = (short)((ulong)uVar2 >> 0x20);
    sStack_c3a = (short)((ulong)uVar2 >> 0x30);
    local_c58 = (short)uVar3;
    sStack_c56 = (short)((ulong)uVar3 >> 0x10);
    sStack_c54 = (short)((ulong)uVar3 >> 0x20);
    sStack_c52 = (short)((ulong)uVar3 >> 0x30);
    sStack_c50 = (short)uVar4;
    sStack_c4e = (short)((ulong)uVar4 >> 0x10);
    sStack_c4c = (short)((ulong)uVar4 >> 0x20);
    sStack_c4a = (short)((ulong)uVar4 >> 0x30);
    local_ca8 = local_c28 * 2 + local_c48 + local_c58;
    sStack_ca6 = sStack_c26 * 2 + sStack_c46 + sStack_c56;
    sStack_ca4 = sStack_c24 * 2 + sStack_c44 + sStack_c54;
    sStack_ca2 = sStack_c22 * 2 + sStack_c42 + sStack_c52;
    local_c88 = CONCAT26(sStack_ca2,CONCAT24(sStack_ca4,CONCAT22(sStack_ca6,local_ca8)));
    local_c98 = local_1288;
    uVar44 = local_c98;
    uStack_c90 = uStack_1280;
    uVar45 = uStack_c90;
    local_c98._0_2_ = (short)local_1288;
    local_c98._2_2_ = (short)((ulong)local_1288 >> 0x10);
    local_c98._4_2_ = (short)((ulong)local_1288 >> 0x20);
    local_c98._6_2_ = (short)((ulong)local_1288 >> 0x30);
    uStack_c90._0_2_ = (short)uStack_1280;
    uStack_c90._2_2_ = (short)((ulong)uStack_1280 >> 0x10);
    uStack_c90._4_2_ = (short)((ulong)uStack_1280 >> 0x20);
    uStack_c90._6_2_ = (short)((ulong)uStack_1280 >> 0x30);
    local_ca8 = local_ca8 + (short)local_c98;
    sStack_ca6 = sStack_ca6 + local_c98._2_2_;
    sStack_ca4 = sStack_ca4 + local_c98._4_2_;
    sStack_ca2 = sStack_ca2 + local_c98._6_2_;
    sStack_ca0 = sStack_c20 * 2 + sStack_c40 + sStack_c50 + (short)uStack_c90;
    sStack_c9e = sStack_c1e * 2 + sStack_c3e + sStack_c4e + uStack_c90._2_2_;
    sStack_c9c = sStack_c1c * 2 + sStack_c3c + sStack_c4c + uStack_c90._4_2_;
    sStack_c9a = sStack_c1a * 2 + sStack_c3a + sStack_c4a + uStack_c90._6_2_;
    lVar5 = (*local_1100)[0];
    lVar6 = (*local_1100)[1];
    local_cb8._0_2_ = (short)lVar5;
    local_cb8._2_2_ = (short)((ulong)lVar5 >> 0x10);
    local_cb8._4_2_ = (short)((ulong)lVar5 >> 0x20);
    local_cb8._6_2_ = (short)((ulong)lVar5 >> 0x30);
    uStack_cb0._0_2_ = (short)lVar6;
    uStack_cb0._2_2_ = (short)((ulong)lVar6 >> 0x10);
    uStack_cb0._4_2_ = (short)((ulong)lVar6 >> 0x20);
    uStack_cb0._6_2_ = (short)((ulong)lVar6 >> 0x30);
    local_cb8._0_2_ = local_ca8 + (short)local_cb8;
    local_cb8._2_2_ = sStack_ca6 + local_cb8._2_2_;
    local_cb8._4_2_ = sStack_ca4 + local_cb8._4_2_;
    local_cb8._6_2_ = sStack_ca2 + local_cb8._6_2_;
    uStack_cb0._0_2_ = sStack_ca0 + (short)uStack_cb0;
    uStack_cb0._2_2_ = sStack_c9e + uStack_cb0._2_2_;
    uStack_cb0._4_2_ = sStack_c9c + uStack_cb0._4_2_;
    uStack_cb0._6_2_ = sStack_c9a + uStack_cb0._6_2_;
    lVar7 = (*local_1108)[0];
    lVar8 = (*local_1108)[1];
    uVar1 = *(undefined8 *)*local_10e0;
    uVar2 = *(undefined8 *)(*local_10e0 + 8);
    local_cc8._0_2_ = (short)lVar7;
    local_cc8._2_2_ = (short)((ulong)lVar7 >> 0x10);
    local_cc8._4_2_ = (short)((ulong)lVar7 >> 0x20);
    local_cc8._6_2_ = (short)((ulong)lVar7 >> 0x30);
    uStack_cc0._0_2_ = (short)lVar8;
    uStack_cc0._2_2_ = (short)((ulong)lVar8 >> 0x10);
    uStack_cc0._4_2_ = (short)((ulong)lVar8 >> 0x20);
    uStack_cc0._6_2_ = (short)((ulong)lVar8 >> 0x30);
    local_cd8._0_2_ = (short)uVar1;
    local_cd8._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_cd8._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_cd8._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_cd0._0_2_ = (short)uVar2;
    uStack_cd0._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_cd0._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_cd0._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_ce8 = (short)local_cc8 + (short)local_cd8;
    sStack_ce6 = local_cc8._2_2_ + local_cd8._2_2_;
    sStack_ce4 = local_cc8._4_2_ + local_cd8._4_2_;
    sStack_ce2 = local_cc8._6_2_ + local_cd8._6_2_;
    sStack_ce0 = (short)uStack_cc0 + (short)uStack_cd0;
    sStack_cde = uStack_cc0._2_2_ + uStack_cd0._2_2_;
    sStack_cdc = uStack_cc0._4_2_ + uStack_cd0._4_2_;
    sStack_cda = uStack_cc0._6_2_ + uStack_cd0._6_2_;
    uVar3 = *(undefined8 *)*local_10d0;
    uVar4 = *(undefined8 *)(*local_10d0 + 8);
    local_cf8._0_2_ = (short)uVar3;
    local_cf8._2_2_ = (short)((ulong)uVar3 >> 0x10);
    local_cf8._4_2_ = (short)((ulong)uVar3 >> 0x20);
    local_cf8._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_cf0._0_2_ = (short)uVar4;
    uStack_cf0._2_2_ = (short)((ulong)uVar4 >> 0x10);
    uStack_cf0._4_2_ = (short)((ulong)uVar4 >> 0x20);
    uStack_cf0._6_2_ = (short)((ulong)uVar4 >> 0x30);
    local_d08 = CONCAT26(local_cb8._6_2_,
                         CONCAT24(local_cb8._4_2_,CONCAT22(local_cb8._2_2_,(short)local_cb8)));
    uStack_d00 = CONCAT26(uStack_cb0._6_2_,
                          CONCAT24(uStack_cb0._4_2_,CONCAT22(uStack_cb0._2_2_,(short)uStack_cb0)));
    local_d18 = CONCAT26(sStack_ce2 + local_cf8._6_2_,
                         CONCAT24(sStack_ce4 + local_cf8._4_2_,
                                  CONCAT22(sStack_ce6 + local_cf8._2_2_,local_ce8 + (short)local_cf8
                                          )));
    uStack_d10 = CONCAT26(sStack_cda + uStack_cf0._6_2_,
                          CONCAT24(sStack_cdc + uStack_cf0._4_2_,
                                   CONCAT22(sStack_cde + uStack_cf0._2_2_,
                                            sStack_ce0 + (short)uStack_cf0)));
    local_11c8 = (ushort)((short)local_cb8 + local_ce8 + (short)local_cf8) >> 3;
    uStack_11c6 = (ushort)(local_cb8._2_2_ + sStack_ce6 + local_cf8._2_2_) >> 3;
    uStack_11c4 = (ushort)(local_cb8._4_2_ + sStack_ce4 + local_cf8._4_2_) >> 3;
    uStack_11c2 = (ushort)(local_cb8._6_2_ + sStack_ce2 + local_cf8._6_2_) >> 3;
    uStack_11c0 = (ushort)((short)uStack_cb0 + sStack_ce0 + (short)uStack_cf0) >> 3;
    uStack_11be = (ushort)(uStack_cb0._2_2_ + sStack_cde + uStack_cf0._2_2_) >> 3;
    uStack_11bc = (ushort)(uStack_cb0._4_2_ + sStack_cdc + uStack_cf0._4_2_) >> 3;
    uStack_11ba = (ushort)(uStack_cb0._6_2_ + sStack_cda + uStack_cf0._6_2_) >> 3;
    lVar9 = (*local_1108)[0];
    lVar10 = (*local_1108)[1];
    lVar11 = (*local_10f8)[0];
    lVar12 = (*local_10f8)[1];
    local_d28._0_2_ = (short)lVar9;
    local_d28._2_2_ = (short)((ulong)lVar9 >> 0x10);
    local_d28._4_2_ = (short)((ulong)lVar9 >> 0x20);
    local_d28._6_2_ = (short)((ulong)lVar9 >> 0x30);
    uStack_d20._0_2_ = (short)lVar10;
    uStack_d20._2_2_ = (short)((ulong)lVar10 >> 0x10);
    uStack_d20._4_2_ = (short)((ulong)lVar10 >> 0x20);
    uStack_d20._6_2_ = (short)((ulong)lVar10 >> 0x30);
    local_d38._0_2_ = (short)lVar11;
    local_d38._2_2_ = (short)((ulong)lVar11 >> 0x10);
    local_d38._4_2_ = (short)((ulong)lVar11 >> 0x20);
    local_d38._6_2_ = (short)((ulong)lVar11 >> 0x30);
    uStack_d30._0_2_ = (short)lVar12;
    uStack_d30._2_2_ = (short)((ulong)lVar12 >> 0x10);
    uStack_d30._4_2_ = (short)((ulong)lVar12 >> 0x20);
    uStack_d30._6_2_ = (short)((ulong)lVar12 >> 0x30);
    local_d48 = (short)local_d28 + (short)local_d38;
    sStack_d46 = local_d28._2_2_ + local_d38._2_2_;
    sStack_d44 = local_d28._4_2_ + local_d38._4_2_;
    sStack_d42 = local_d28._6_2_ + local_d38._6_2_;
    sStack_d40 = (short)uStack_d20 + (short)uStack_d30;
    sStack_d3e = uStack_d20._2_2_ + uStack_d30._2_2_;
    sStack_d3c = uStack_d20._4_2_ + uStack_d30._4_2_;
    sStack_d3a = uStack_d20._6_2_ + uStack_d30._6_2_;
    uVar13 = *(undefined8 *)*local_10f0;
    uVar14 = *(undefined8 *)(*local_10f0 + 8);
    local_d58._0_2_ = (short)uVar13;
    local_d58._2_2_ = (short)((ulong)uVar13 >> 0x10);
    local_d58._4_2_ = (short)((ulong)uVar13 >> 0x20);
    local_d58._6_2_ = (short)((ulong)uVar13 >> 0x30);
    uStack_d50._0_2_ = (short)uVar14;
    uStack_d50._2_2_ = (short)((ulong)uVar14 >> 0x10);
    uStack_d50._4_2_ = (short)((ulong)uVar14 >> 0x20);
    uStack_d50._6_2_ = (short)((ulong)uVar14 >> 0x30);
    local_d58._0_2_ = local_d48 + (short)local_d58;
    local_d58._2_2_ = sStack_d46 + local_d58._2_2_;
    local_d58._4_2_ = sStack_d44 + local_d58._4_2_;
    local_d58._6_2_ = sStack_d42 + local_d58._6_2_;
    uStack_d50._0_2_ = sStack_d40 + (short)uStack_d50;
    uStack_d50._2_2_ = sStack_d3e + uStack_d50._2_2_;
    uStack_d50._4_2_ = sStack_d3c + uStack_d50._4_2_;
    uStack_d50._6_2_ = sStack_d3a + uStack_d50._6_2_;
    local_d68 = CONCAT26(local_cb8._6_2_,
                         CONCAT24(local_cb8._4_2_,CONCAT22(local_cb8._2_2_,(short)local_cb8)));
    uStack_d60 = CONCAT26(uStack_cb0._6_2_,
                          CONCAT24(uStack_cb0._4_2_,CONCAT22(uStack_cb0._2_2_,(short)uStack_cb0)));
    local_d78 = CONCAT26(local_d58._6_2_,
                         CONCAT24(local_d58._4_2_,CONCAT22(local_d58._2_2_,(short)local_d58)));
    uStack_d70 = CONCAT26(uStack_d50._6_2_,
                          CONCAT24(uStack_d50._4_2_,CONCAT22(uStack_d50._2_2_,(short)uStack_d50)));
    local_11e8 = CONCAT26((ushort)(local_cb8._6_2_ + local_d58._6_2_) >> 3,
                          CONCAT24((ushort)(local_cb8._4_2_ + local_d58._4_2_) >> 3,
                                   CONCAT22((ushort)(local_cb8._2_2_ + local_d58._2_2_) >> 3,
                                            (ushort)((short)local_cb8 + (short)local_d58) >> 3)));
    uStack_11e0 = CONCAT26((ushort)(uStack_cb0._6_2_ + uStack_d50._6_2_) >> 3,
                           CONCAT24((ushort)(uStack_cb0._4_2_ + uStack_d50._4_2_) >> 3,
                                    CONCAT22((ushort)(uStack_cb0._2_2_ + uStack_d50._2_2_) >> 3,
                                             (ushort)((short)uStack_cb0 + (short)uStack_d50) >> 3)))
    ;
    uVar15 = *(undefined8 *)*local_10d0;
    uVar16 = *(undefined8 *)(*local_10d0 + 8);
    local_b38 = (short)uVar15;
    sStack_b36 = (short)((ulong)uVar15 >> 0x10);
    sStack_b34 = (short)((ulong)uVar15 >> 0x20);
    sStack_b32 = (short)((ulong)uVar15 >> 0x30);
    sStack_b30 = (short)uVar16;
    sStack_b2e = (short)((ulong)uVar16 >> 0x10);
    sStack_b2c = (short)((ulong)uVar16 >> 0x20);
    sStack_b2a = (short)((ulong)uVar16 >> 0x30);
    local_d88 = (short)local_cb8 - local_b38;
    sStack_d86 = local_cb8._2_2_ - sStack_b36;
    sStack_d84 = local_cb8._4_2_ - sStack_b34;
    sStack_d82 = local_cb8._6_2_ - sStack_b32;
    sStack_d80 = (short)uStack_cb0 - sStack_b30;
    sStack_d7e = uStack_cb0._2_2_ - sStack_b2e;
    sStack_d7c = uStack_cb0._4_2_ - sStack_b2c;
    sStack_d7a = uStack_cb0._6_2_ - sStack_b2a;
    lVar17 = (*local_10e8)[0];
    lVar18 = (*local_10e8)[1];
    local_d98._0_2_ = (short)lVar17;
    local_d98._2_2_ = (short)((ulong)lVar17 >> 0x10);
    local_d98._4_2_ = (short)((ulong)lVar17 >> 0x20);
    local_d98._6_2_ = (short)((ulong)lVar17 >> 0x30);
    uStack_d90._0_2_ = (short)lVar18;
    uStack_d90._2_2_ = (short)((ulong)lVar18 >> 0x10);
    uStack_d90._4_2_ = (short)((ulong)lVar18 >> 0x20);
    uStack_d90._6_2_ = (short)((ulong)lVar18 >> 0x30);
    local_d98._0_2_ = local_d88 + (short)local_d98;
    local_d98._2_2_ = sStack_d86 + local_d98._2_2_;
    local_d98._4_2_ = sStack_d84 + local_d98._4_2_;
    local_d98._6_2_ = sStack_d82 + local_d98._6_2_;
    uStack_d90._0_2_ = sStack_d80 + (short)uStack_d90;
    uStack_d90._2_2_ = sStack_d7e + uStack_d90._2_2_;
    uStack_d90._4_2_ = sStack_d7c + uStack_d90._4_2_;
    uStack_d90._6_2_ = sStack_d7a + uStack_d90._6_2_;
    uVar15 = *(undefined8 *)*local_10f0;
    uVar16 = *(undefined8 *)(*local_10f0 + 8);
    local_b58 = (short)uVar15;
    sStack_b56 = (short)((ulong)uVar15 >> 0x10);
    sStack_b54 = (short)((ulong)uVar15 >> 0x20);
    sStack_b52 = (short)((ulong)uVar15 >> 0x30);
    sStack_b50 = (short)uVar16;
    sStack_b4e = (short)((ulong)uVar16 >> 0x10);
    sStack_b4c = (short)((ulong)uVar16 >> 0x20);
    sStack_b4a = (short)((ulong)uVar16 >> 0x30);
    local_da8 = (short)local_d58 - local_b58;
    sStack_da6 = local_d58._2_2_ - sStack_b56;
    sStack_da4 = local_d58._4_2_ - sStack_b54;
    sStack_da2 = local_d58._6_2_ - sStack_b52;
    sStack_da0 = (short)uStack_d50 - sStack_b50;
    sStack_d9e = uStack_d50._2_2_ - sStack_b4e;
    sStack_d9c = uStack_d50._4_2_ - sStack_b4c;
    sStack_d9a = uStack_d50._6_2_ - sStack_b4a;
    lVar19 = (*local_1100)[0];
    lVar20 = (*local_1100)[1];
    local_db8._0_2_ = (short)lVar19;
    local_db8._2_2_ = (short)((ulong)lVar19 >> 0x10);
    local_db8._4_2_ = (short)((ulong)lVar19 >> 0x20);
    local_db8._6_2_ = (short)((ulong)lVar19 >> 0x30);
    uStack_db0._0_2_ = (short)lVar20;
    uStack_db0._2_2_ = (short)((ulong)lVar20 >> 0x10);
    uStack_db0._4_2_ = (short)((ulong)lVar20 >> 0x20);
    uStack_db0._6_2_ = (short)((ulong)lVar20 >> 0x30);
    local_db8._0_2_ = local_da8 + (short)local_db8;
    local_db8._2_2_ = sStack_da6 + local_db8._2_2_;
    local_db8._4_2_ = sStack_da4 + local_db8._4_2_;
    local_db8._6_2_ = sStack_da2 + local_db8._6_2_;
    uStack_db0._0_2_ = sStack_da0 + (short)uStack_db0;
    uStack_db0._2_2_ = sStack_d9e + uStack_db0._2_2_;
    uStack_db0._4_2_ = sStack_d9c + uStack_db0._4_2_;
    uStack_db0._6_2_ = sStack_d9a + uStack_db0._6_2_;
    local_dc8 = CONCAT26(local_d98._6_2_,
                         CONCAT24(local_d98._4_2_,CONCAT22(local_d98._2_2_,(short)local_d98)));
    uStack_dc0 = CONCAT26(uStack_d90._6_2_,
                          CONCAT24(uStack_d90._4_2_,CONCAT22(uStack_d90._2_2_,(short)uStack_d90)));
    local_dd8 = CONCAT26(local_db8._6_2_,
                         CONCAT24(local_db8._4_2_,CONCAT22(local_db8._2_2_,(short)local_db8)));
    uStack_dd0 = CONCAT26(uStack_db0._6_2_,
                          CONCAT24(uStack_db0._4_2_,CONCAT22(uStack_db0._2_2_,(short)uStack_db0)));
    local_11f8 = CONCAT26((ushort)(local_d98._6_2_ + local_db8._6_2_) >> 3,
                          CONCAT24((ushort)(local_d98._4_2_ + local_db8._4_2_) >> 3,
                                   CONCAT22((ushort)(local_d98._2_2_ + local_db8._2_2_) >> 3,
                                            (ushort)((short)local_d98 + (short)local_db8) >> 3)));
    uStack_11f0 = CONCAT26((ushort)(uStack_d90._6_2_ + uStack_db0._6_2_) >> 3,
                           CONCAT24((ushort)(uStack_d90._4_2_ + uStack_db0._4_2_) >> 3,
                                    CONCAT22((ushort)(uStack_d90._2_2_ + uStack_db0._2_2_) >> 3,
                                             (ushort)((short)uStack_d90 + (short)uStack_db0) >> 3)))
    ;
    uVar15 = *(undefined8 *)*local_10d0;
    uVar16 = *(undefined8 *)(*local_10d0 + 8);
    local_b78 = (short)uVar15;
    sStack_b76 = (short)((ulong)uVar15 >> 0x10);
    sStack_b74 = (short)((ulong)uVar15 >> 0x20);
    sStack_b72 = (short)((ulong)uVar15 >> 0x30);
    sStack_b70 = (short)uVar16;
    sStack_b6e = (short)((ulong)uVar16 >> 0x10);
    sStack_b6c = (short)((ulong)uVar16 >> 0x20);
    sStack_b6a = (short)((ulong)uVar16 >> 0x30);
    local_de8 = (short)local_d98 - local_b78;
    sStack_de6 = local_d98._2_2_ - sStack_b76;
    sStack_de4 = local_d98._4_2_ - sStack_b74;
    sStack_de2 = local_d98._6_2_ - sStack_b72;
    sStack_de0 = (short)uStack_d90 - sStack_b70;
    sStack_dde = uStack_d90._2_2_ - sStack_b6e;
    sStack_ddc = uStack_d90._4_2_ - sStack_b6c;
    sStack_dda = uStack_d90._6_2_ - sStack_b6a;
    lVar21 = (*local_10d8)[0];
    lVar22 = (*local_10d8)[1];
    local_df8._0_2_ = (short)lVar21;
    local_df8._2_2_ = (short)((ulong)lVar21 >> 0x10);
    local_df8._4_2_ = (short)((ulong)lVar21 >> 0x20);
    local_df8._6_2_ = (short)((ulong)lVar21 >> 0x30);
    uStack_df0._0_2_ = (short)lVar22;
    uStack_df0._2_2_ = (short)((ulong)lVar22 >> 0x10);
    uStack_df0._4_2_ = (short)((ulong)lVar22 >> 0x20);
    uStack_df0._6_2_ = (short)((ulong)lVar22 >> 0x30);
    local_df8._0_2_ = local_de8 + (short)local_df8;
    local_df8._2_2_ = sStack_de6 + local_df8._2_2_;
    local_df8._4_2_ = sStack_de4 + local_df8._4_2_;
    local_df8._6_2_ = sStack_de2 + local_df8._6_2_;
    uStack_df0._0_2_ = sStack_de0 + (short)uStack_df0;
    uStack_df0._2_2_ = sStack_dde + uStack_df0._2_2_;
    uStack_df0._4_2_ = sStack_ddc + uStack_df0._4_2_;
    uStack_df0._6_2_ = sStack_dda + uStack_df0._6_2_;
    lVar23 = (*local_1100)[0];
    lVar24 = (*local_1100)[1];
    local_b98 = (short)lVar23;
    sStack_b96 = (short)((ulong)lVar23 >> 0x10);
    sStack_b94 = (short)((ulong)lVar23 >> 0x20);
    sStack_b92 = (short)((ulong)lVar23 >> 0x30);
    sStack_b90 = (short)lVar24;
    sStack_b8e = (short)((ulong)lVar24 >> 0x10);
    sStack_b8c = (short)((ulong)lVar24 >> 0x20);
    sStack_b8a = (short)((ulong)lVar24 >> 0x30);
    local_e08 = (short)local_db8 - local_b98;
    sStack_e06 = local_db8._2_2_ - sStack_b96;
    sStack_e04 = local_db8._4_2_ - sStack_b94;
    sStack_e02 = local_db8._6_2_ - sStack_b92;
    sStack_e00 = (short)uStack_db0 - sStack_b90;
    sStack_dfe = uStack_db0._2_2_ - sStack_b8e;
    sStack_dfc = uStack_db0._4_2_ - sStack_b8c;
    sStack_dfa = uStack_db0._6_2_ - sStack_b8a;
    lVar23 = (*local_1108)[0];
    lVar24 = (*local_1108)[1];
    local_e18._0_2_ = (short)lVar23;
    local_e18._2_2_ = (short)((ulong)lVar23 >> 0x10);
    local_e18._4_2_ = (short)((ulong)lVar23 >> 0x20);
    local_e18._6_2_ = (short)((ulong)lVar23 >> 0x30);
    uStack_e10._0_2_ = (short)lVar24;
    uStack_e10._2_2_ = (short)((ulong)lVar24 >> 0x10);
    uStack_e10._4_2_ = (short)((ulong)lVar24 >> 0x20);
    uStack_e10._6_2_ = (short)((ulong)lVar24 >> 0x30);
    local_e18._0_2_ = local_e08 + (short)local_e18;
    local_e18._2_2_ = sStack_e06 + local_e18._2_2_;
    local_e18._4_2_ = sStack_e04 + local_e18._4_2_;
    local_e18._6_2_ = sStack_e02 + local_e18._6_2_;
    uStack_e10._0_2_ = sStack_e00 + (short)uStack_e10;
    uStack_e10._2_2_ = sStack_dfe + uStack_e10._2_2_;
    uStack_e10._4_2_ = sStack_dfc + uStack_e10._4_2_;
    uStack_e10._6_2_ = sStack_dfa + uStack_e10._6_2_;
    local_e28 = CONCAT26(local_df8._6_2_,
                         CONCAT24(local_df8._4_2_,CONCAT22(local_df8._2_2_,(short)local_df8)));
    uStack_e20 = CONCAT26(uStack_df0._6_2_,
                          CONCAT24(uStack_df0._4_2_,CONCAT22(uStack_df0._2_2_,(short)uStack_df0)));
    local_e38 = CONCAT26(local_e18._6_2_,
                         CONCAT24(local_e18._4_2_,CONCAT22(local_e18._2_2_,(short)local_e18)));
    uStack_e30 = CONCAT26(uStack_e10._6_2_,
                          CONCAT24(uStack_e10._4_2_,CONCAT22(uStack_e10._2_2_,(short)uStack_e10)));
    local_1208 = CONCAT26((ushort)(local_df8._6_2_ + local_e18._6_2_) >> 3,
                          CONCAT24((ushort)(local_df8._4_2_ + local_e18._4_2_) >> 3,
                                   CONCAT22((ushort)(local_df8._2_2_ + local_e18._2_2_) >> 3,
                                            (ushort)((short)local_df8 + (short)local_e18) >> 3)));
    uStack_1200 = CONCAT26((ushort)(uStack_df0._6_2_ + uStack_e10._6_2_) >> 3,
                           CONCAT24((ushort)(uStack_df0._4_2_ + uStack_e10._4_2_) >> 3,
                                    CONCAT22((ushort)(uStack_df0._2_2_ + uStack_e10._2_2_) >> 3,
                                             (ushort)((short)uStack_df0 + (short)uStack_e10) >> 3)))
    ;
    uVar15 = *(undefined8 *)*local_10e0;
    uVar16 = *(undefined8 *)(*local_10e0 + 8);
    local_bb8 = (short)uVar15;
    sStack_bb6 = (short)((ulong)uVar15 >> 0x10);
    sStack_bb4 = (short)((ulong)uVar15 >> 0x20);
    sStack_bb2 = (short)((ulong)uVar15 >> 0x30);
    sStack_bb0 = (short)uVar16;
    sStack_bae = (short)((ulong)uVar16 >> 0x10);
    sStack_bac = (short)((ulong)uVar16 >> 0x20);
    sStack_baa = (short)((ulong)uVar16 >> 0x30);
    local_e48 = (short)local_df8 - local_bb8;
    sStack_e46 = local_df8._2_2_ - sStack_bb6;
    sStack_e44 = local_df8._4_2_ - sStack_bb4;
    sStack_e42 = local_df8._6_2_ - sStack_bb2;
    sStack_e40 = (short)uStack_df0 - sStack_bb0;
    sStack_e3e = uStack_df0._2_2_ - sStack_bae;
    sStack_e3c = uStack_df0._4_2_ - sStack_bac;
    sStack_e3a = uStack_df0._6_2_ - sStack_baa;
    lVar25 = (*local_10d8)[0];
    lVar26 = (*local_10d8)[1];
    local_e58._0_2_ = (short)lVar25;
    local_e58._2_2_ = (short)((ulong)lVar25 >> 0x10);
    local_e58._4_2_ = (short)((ulong)lVar25 >> 0x20);
    local_e58._6_2_ = (short)((ulong)lVar25 >> 0x30);
    uStack_e50._0_2_ = (short)lVar26;
    uStack_e50._2_2_ = (short)((ulong)lVar26 >> 0x10);
    uStack_e50._4_2_ = (short)((ulong)lVar26 >> 0x20);
    uStack_e50._6_2_ = (short)((ulong)lVar26 >> 0x30);
    local_e58._0_2_ = local_e48 + (short)local_e58;
    local_e58._2_2_ = sStack_e46 + local_e58._2_2_;
    local_e58._4_2_ = sStack_e44 + local_e58._4_2_;
    local_e58._6_2_ = sStack_e42 + local_e58._6_2_;
    uStack_e50._0_2_ = sStack_e40 + (short)uStack_e50;
    uStack_e50._2_2_ = sStack_e3e + uStack_e50._2_2_;
    uStack_e50._4_2_ = sStack_e3c + uStack_e50._4_2_;
    uStack_e50._6_2_ = sStack_e3a + uStack_e50._6_2_;
    lVar27 = (*local_1108)[0];
    lVar28 = (*local_1108)[1];
    local_bd8 = (short)lVar27;
    sStack_bd6 = (short)((ulong)lVar27 >> 0x10);
    sStack_bd4 = (short)((ulong)lVar27 >> 0x20);
    sStack_bd2 = (short)((ulong)lVar27 >> 0x30);
    sStack_bd0 = (short)lVar28;
    sStack_bce = (short)((ulong)lVar28 >> 0x10);
    sStack_bcc = (short)((ulong)lVar28 >> 0x20);
    sStack_bca = (short)((ulong)lVar28 >> 0x30);
    local_e68 = (short)local_e18 - local_bd8;
    sStack_e66 = local_e18._2_2_ - sStack_bd6;
    sStack_e64 = local_e18._4_2_ - sStack_bd4;
    sStack_e62 = local_e18._6_2_ - sStack_bd2;
    sStack_e60 = (short)uStack_e10 - sStack_bd0;
    sStack_e5e = uStack_e10._2_2_ - sStack_bce;
    sStack_e5c = uStack_e10._4_2_ - sStack_bcc;
    sStack_e5a = uStack_e10._6_2_ - sStack_bca;
    lVar27 = (*local_10f8)[0];
    lVar28 = (*local_10f8)[1];
    local_e78._0_2_ = (short)lVar27;
    local_e78._2_2_ = (short)((ulong)lVar27 >> 0x10);
    local_e78._4_2_ = (short)((ulong)lVar27 >> 0x20);
    local_e78._6_2_ = (short)((ulong)lVar27 >> 0x30);
    uStack_e70._0_2_ = (short)lVar28;
    uStack_e70._2_2_ = (short)((ulong)lVar28 >> 0x10);
    uStack_e70._4_2_ = (short)((ulong)lVar28 >> 0x20);
    uStack_e70._6_2_ = (short)((ulong)lVar28 >> 0x30);
    local_e78._0_2_ = local_e68 + (short)local_e78;
    local_e78._2_2_ = sStack_e66 + local_e78._2_2_;
    local_e78._4_2_ = sStack_e64 + local_e78._4_2_;
    local_e78._6_2_ = sStack_e62 + local_e78._6_2_;
    uStack_e70._0_2_ = sStack_e60 + (short)uStack_e70;
    uStack_e70._2_2_ = sStack_e5e + uStack_e70._2_2_;
    uStack_e70._4_2_ = sStack_e5c + uStack_e70._4_2_;
    uStack_e70._6_2_ = sStack_e5a + uStack_e70._6_2_;
    local_e88 = CONCAT26(local_e58._6_2_,
                         CONCAT24(local_e58._4_2_,CONCAT22(local_e58._2_2_,(short)local_e58)));
    uStack_e80 = CONCAT26(uStack_e50._6_2_,
                          CONCAT24(uStack_e50._4_2_,CONCAT22(uStack_e50._2_2_,(short)uStack_e50)));
    local_e98 = CONCAT26(local_e78._6_2_,
                         CONCAT24(local_e78._4_2_,CONCAT22(local_e78._2_2_,(short)local_e78)));
    uStack_e90 = CONCAT26(uStack_e70._6_2_,
                          CONCAT24(uStack_e70._4_2_,CONCAT22(uStack_e70._2_2_,(short)uStack_e70)));
    local_1218 = CONCAT26((ushort)(local_e58._6_2_ + local_e78._6_2_) >> 3,
                          CONCAT24((ushort)(local_e58._4_2_ + local_e78._4_2_) >> 3,
                                   CONCAT22((ushort)(local_e58._2_2_ + local_e78._2_2_) >> 3,
                                            (ushort)((short)local_e58 + (short)local_e78) >> 3)));
    uStack_1210 = CONCAT26((ushort)(uStack_e50._6_2_ + uStack_e70._6_2_) >> 3,
                           CONCAT24((ushort)(uStack_e50._4_2_ + uStack_e70._4_2_) >> 3,
                                    CONCAT22((ushort)(uStack_e50._2_2_ + uStack_e70._2_2_) >> 3,
                                             (ushort)((short)uStack_e50 + (short)uStack_e70) >> 3)))
    ;
    uVar15 = *(undefined8 *)*local_10f0;
    uVar16 = *(undefined8 *)(*local_10f0 + 8);
    local_bf8 = (short)uVar15;
    sStack_bf6 = (short)((ulong)uVar15 >> 0x10);
    sStack_bf4 = (short)((ulong)uVar15 >> 0x20);
    sStack_bf2 = (short)((ulong)uVar15 >> 0x30);
    sStack_bf0 = (short)uVar16;
    sStack_bee = (short)((ulong)uVar16 >> 0x10);
    sStack_bec = (short)((ulong)uVar16 >> 0x20);
    sStack_bea = (short)((ulong)uVar16 >> 0x30);
    local_ea8 = (short)local_e58 - local_bf8;
    sStack_ea6 = local_e58._2_2_ - sStack_bf6;
    sStack_ea4 = local_e58._4_2_ - sStack_bf4;
    sStack_ea2 = local_e58._6_2_ - sStack_bf2;
    sStack_ea0 = (short)uStack_e50 - sStack_bf0;
    sStack_e9e = uStack_e50._2_2_ - sStack_bee;
    sStack_e9c = uStack_e50._4_2_ - sStack_bec;
    sStack_e9a = uStack_e50._6_2_ - sStack_bea;
    lVar29 = (*local_10d8)[0];
    lVar30 = (*local_10d8)[1];
    local_eb8._0_2_ = (short)lVar29;
    local_eb8._2_2_ = (short)((ulong)lVar29 >> 0x10);
    local_eb8._4_2_ = (short)((ulong)lVar29 >> 0x20);
    local_eb8._6_2_ = (short)((ulong)lVar29 >> 0x30);
    uStack_eb0._0_2_ = (short)lVar30;
    uStack_eb0._2_2_ = (short)((ulong)lVar30 >> 0x10);
    uStack_eb0._4_2_ = (short)((ulong)lVar30 >> 0x20);
    uStack_eb0._6_2_ = (short)((ulong)lVar30 >> 0x30);
    local_1338 = local_ea8 + (short)local_eb8;
    sStack_1336 = sStack_ea6 + local_eb8._2_2_;
    sStack_1334 = sStack_ea4 + local_eb8._4_2_;
    sStack_1332 = sStack_ea2 + local_eb8._6_2_;
    sStack_1330 = sStack_ea0 + (short)uStack_eb0;
    sStack_132e = sStack_e9e + uStack_eb0._2_2_;
    sStack_132c = sStack_e9c + uStack_eb0._4_2_;
    sStack_132a = sStack_e9a + uStack_eb0._6_2_;
    lVar31 = (*local_10f8)[0];
    lVar32 = (*local_10f8)[1];
    local_c18 = (short)lVar31;
    sStack_c16 = (short)((ulong)lVar31 >> 0x10);
    sStack_c14 = (short)((ulong)lVar31 >> 0x20);
    sStack_c12 = (short)((ulong)lVar31 >> 0x30);
    sStack_c10 = (short)lVar32;
    sStack_c0e = (short)((ulong)lVar32 >> 0x10);
    sStack_c0c = (short)((ulong)lVar32 >> 0x20);
    sStack_c0a = (short)((ulong)lVar32 >> 0x30);
    local_ec8 = (short)local_e78 - local_c18;
    sStack_ec6 = local_e78._2_2_ - sStack_c16;
    sStack_ec4 = local_e78._4_2_ - sStack_c14;
    sStack_ec2 = local_e78._6_2_ - sStack_c12;
    sStack_ec0 = (short)uStack_e70 - sStack_c10;
    sStack_ebe = uStack_e70._2_2_ - sStack_c0e;
    sStack_ebc = uStack_e70._4_2_ - sStack_c0c;
    sStack_eba = uStack_e70._6_2_ - sStack_c0a;
    lVar31 = (*local_10e8)[0];
    lVar32 = (*local_10e8)[1];
    local_ed8._0_2_ = (short)lVar31;
    local_ed8._2_2_ = (short)((ulong)lVar31 >> 0x10);
    local_ed8._4_2_ = (short)((ulong)lVar31 >> 0x20);
    local_ed8._6_2_ = (short)((ulong)lVar31 >> 0x30);
    uStack_ed0._0_2_ = (short)lVar32;
    uStack_ed0._2_2_ = (short)((ulong)lVar32 >> 0x10);
    uStack_ed0._4_2_ = (short)((ulong)lVar32 >> 0x20);
    uStack_ed0._6_2_ = (short)((ulong)lVar32 >> 0x30);
    local_1348 = local_ec8 + (short)local_ed8;
    sStack_1346 = sStack_ec6 + local_ed8._2_2_;
    sStack_1344 = sStack_ec4 + local_ed8._4_2_;
    sStack_1342 = sStack_ec2 + local_ed8._6_2_;
    sStack_1340 = sStack_ec0 + (short)uStack_ed0;
    sStack_133e = sStack_ebe + uStack_ed0._2_2_;
    sStack_133c = sStack_ebc + uStack_ed0._4_2_;
    sStack_133a = sStack_eba + uStack_ed0._6_2_;
    local_ee8 = CONCAT26(sStack_1332,CONCAT24(sStack_1334,CONCAT22(sStack_1336,local_1338)));
    uStack_ee0 = CONCAT26(sStack_132a,CONCAT24(sStack_132c,CONCAT22(sStack_132e,sStack_1330)));
    local_ef8 = CONCAT26(sStack_1342,CONCAT24(sStack_1344,CONCAT22(sStack_1346,local_1348)));
    uStack_ef0 = CONCAT26(sStack_133a,CONCAT24(sStack_133c,CONCAT22(sStack_133e,sStack_1340)));
    local_11d8 = (ushort)(local_1338 + local_1348) >> 3;
    uStack_11d6 = (ushort)(sStack_1336 + sStack_1346) >> 3;
    uStack_11d4 = (ushort)(sStack_1334 + sStack_1344) >> 3;
    uStack_11d2 = (ushort)(sStack_1332 + sStack_1342) >> 3;
    uStack_11d0 = (ushort)(sStack_1330 + sStack_1340) >> 3;
    uStack_11ce = (ushort)(sStack_132e + sStack_133e) >> 3;
    uStack_11cc = (ushort)(sStack_132c + sStack_133c) >> 3;
    uStack_11ca = (ushort)(sStack_132a + sStack_133a) >> 3;
    local_12e8 = ~local_11a8 & local_12e8;
    uStack_12e0 = ~uStack_11a0 & uStack_12e0;
    local_1018 = local_1208;
    uStack_1010 = uStack_1200;
    local_1208 = local_11a8 & local_1208;
    uStack_1200 = uStack_11a0 & uStack_1200;
    uVar49 = uStack_12e0 | uStack_1200;
    local_1008 = local_11a8;
    uStack_1000 = uStack_11a0;
    local_ed8 = lVar31;
    uStack_ed0 = lVar32;
    local_eb8 = lVar29;
    uStack_eb0 = lVar30;
    local_e78 = lVar27;
    uStack_e70 = lVar28;
    local_e58 = lVar25;
    uStack_e50 = lVar26;
    local_e18 = lVar23;
    uStack_e10 = lVar24;
    local_df8 = lVar21;
    uStack_df0 = lVar22;
    local_db8 = lVar19;
    uStack_db0 = lVar20;
    local_d98 = lVar17;
    uStack_d90 = lVar18;
    local_d58 = uVar13;
    uStack_d50 = uVar14;
    local_d38 = lVar11;
    uStack_d30 = lVar12;
    local_d28 = lVar9;
    uStack_d20 = lVar10;
    local_cf8 = uVar3;
    uStack_cf0 = uVar4;
    local_cd8 = uVar1;
    uStack_cd0 = uVar2;
    local_cc8 = lVar7;
    uStack_cc0 = lVar8;
    local_cb8 = lVar5;
    uStack_cb0 = lVar6;
    local_c98 = uVar44;
    uStack_c90 = uVar45;
    (*local_1108)[0] = local_12e8 | local_1208;
    (*palVar42)[1] = uVar49;
    palVar42 = local_10f8;
    local_12d8 = ~local_11a8 & local_12d8;
    uStack_12d0 = ~uStack_11a0 & uStack_12d0;
    local_1028 = local_11a8;
    uStack_1020 = uStack_11a0;
    local_1038 = local_1218;
    uStack_1030 = uStack_1210;
    local_1218 = local_11a8 & local_1218;
    uStack_1210 = uStack_11a0 & uStack_1210;
    uVar49 = uStack_12d0 | uStack_1210;
    (*local_10f8)[0] = local_12d8 | local_1218;
    (*palVar42)[1] = uVar49;
    palVar42 = local_1100;
    local_12c8 = ~local_11a8 & local_12c8;
    uStack_12c0 = ~uStack_11a0 & uStack_12c0;
    local_1048 = local_11a8;
    uStack_1040 = uStack_11a0;
    local_1058 = local_11f8;
    uStack_1050 = uStack_11f0;
    local_11f8 = local_11a8 & local_11f8;
    uStack_11f0 = uStack_11a0 & uStack_11f0;
    uVar49 = uStack_12c0 | uStack_11f0;
    (*local_1100)[0] = local_12c8 | local_11f8;
    (*palVar42)[1] = uVar49;
    pauVar43 = local_10f0;
    local_12b8 = ~local_11a8 & local_12b8;
    uStack_12b0 = ~uStack_11a0 & uStack_12b0;
    local_1068 = local_11a8;
    uStack_1060 = uStack_11a0;
    local_1078 = local_11e8;
    uStack_1070 = uStack_11e0;
    local_11e8 = local_11a8 & local_11e8;
    uStack_11e0 = uStack_11a0 & uStack_11e0;
    uVar49 = uStack_12b0 | uStack_11e0;
    *(ulong *)*local_10f0 = local_12b8 | local_11e8;
    *(ulong *)(*pauVar43 + 8) = uVar49;
    palVar42 = local_10e8;
    local_11b8 = ~local_11a8 & (*local_10e8)[0];
    uStack_11b0 = ~uStack_11a0 & (*local_10e8)[1];
    local_1098 = CONCAT26(uStack_11d2,CONCAT24(uStack_11d4,CONCAT22(uStack_11d6,local_11d8)));
    uStack_1090 = CONCAT26(uStack_11ca,CONCAT24(uStack_11cc,CONCAT22(uStack_11ce,uStack_11d0)));
    local_1088 = local_11a8;
    uStack_1080 = uStack_11a0;
    uVar49 = uStack_11a0 & uStack_1090;
    (*local_10e8)[0] = local_11a8 & local_1098;
    (*palVar42)[1] = uVar49;
    palVar42 = local_10e8;
    uVar49 = (*local_10e8)[1];
    (*local_10e8)[0] = local_11b8 | (*local_10e8)[0];
    (*palVar42)[1] = uStack_11b0 | uVar49;
    pauVar43 = local_10e0;
    local_a28 = (uint)local_11a8;
    uStack_a24 = (uint)(local_11a8 >> 0x20);
    uStack_a20 = (uint)uStack_11a0;
    uStack_a1c = (uint)(uStack_11a0 >> 0x20);
    local_a38 = (uint)*(undefined8 *)*local_10e0;
    uStack_a34 = (uint)((ulong)*(undefined8 *)*local_10e0 >> 0x20);
    uStack_a30 = (uint)*(undefined8 *)(*local_10e0 + 8);
    uStack_a2c = (uint)((ulong)*(undefined8 *)(*local_10e0 + 8) >> 0x20);
    local_11b8 = CONCAT44((uStack_a24 ^ 0xffffffff) & uStack_a34,
                          (local_a28 ^ 0xffffffff) & local_a38);
    uStack_11b0 = CONCAT44((uStack_a1c ^ 0xffffffff) & uStack_a2c,
                           (uStack_a20 ^ 0xffffffff) & uStack_a30);
    local_10b8 = CONCAT26(uStack_11c2,CONCAT24(uStack_11c4,CONCAT22(uStack_11c6,local_11c8)));
    uStack_10b0 = CONCAT26(uStack_11ba,CONCAT24(uStack_11bc,CONCAT22(uStack_11be,uStack_11c0)));
    local_10a8 = local_11a8;
    uStack_10a0 = uStack_11a0;
    uVar49 = uStack_11a0 & uStack_10b0;
    *(ulong *)*local_10e0 = local_11a8 & local_10b8;
    *(ulong *)(*pauVar43 + 8) = uVar49;
    pauVar43 = local_10e0;
    uVar49 = uStack_11b0 | *(ulong *)(*local_10e0 + 8);
    *(ulong *)*local_10e0 = local_11b8 | *(ulong *)*local_10e0;
    *(ulong *)(*pauVar43 + 8) = uVar49;
  }
  highbd_transpose8x8_sse2
            ((__m128i *)&stack0xffffffffffffea58,(__m128i *)&local_1538,(__m128i *)&local_1528,
             (__m128i *)&local_1518,(__m128i *)&local_1508,(__m128i *)&local_14f8,
             (__m128i *)CONCAT26(uVar61,CONCAT24(uVar60,in_stack_ffffffffffffea30)),t80_out,thr_out,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea50,in_stack_ffffffffffffea58,
             in_stack_ffffffffffffea60,in_stack_ffffffffffffea68,in_stack_ffffffffffffea70,
             in_stack_ffffffffffffea78);
  local_1490[-1] = local_14c8;
  *local_1490 = uStack_14c0;
  puVar46 = (undefined8 *)((long)local_1490 + (long)local_1494 * 2 + -8);
  *puVar46 = local_14d8;
  puVar46[1] = uStack_14d0;
  puVar46 = (undefined8 *)((long)local_1490 + (long)(local_1494 << 1) * 2 + -8);
  *puVar46 = local_14e8;
  puVar46[1] = uStack_14e0;
  plVar47 = (longlong *)((long)local_1490 + (long)(local_1494 * 3) * 2 + -8);
  *plVar47 = local_14f8;
  plVar47[1] = lStack_14f0;
  plVar47 = (longlong *)((long)local_1490 + (long)(local_1494 << 2) * 2 + -8);
  *plVar47 = local_1508;
  plVar47[1] = lStack_1500;
  plVar47 = (longlong *)((long)local_1490 + (long)(local_1494 * 5) * 2 + -8);
  *plVar47 = local_1518;
  plVar47[1] = lStack_1510;
  plVar47 = (longlong *)((long)local_1490 + (long)(local_1494 * 6) * 2 + -8);
  *plVar47 = local_1528;
  plVar47[1] = lStack_1520;
  plVar47 = (longlong *)((long)local_1490 + (long)(local_1494 * 7) * 2 + -8);
  *plVar47 = local_1538;
  plVar47[1] = lStack_1530;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_8_dual_sse2(
    uint16_t *s, int p, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;

  x0 = _mm_loadu_si128((__m128i *)(s - 4 + 0 * p));
  x1 = _mm_loadu_si128((__m128i *)(s - 4 + 1 * p));
  x2 = _mm_loadu_si128((__m128i *)(s - 4 + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)(s - 4 + 3 * p));
  x4 = _mm_loadu_si128((__m128i *)(s - 4 + 4 * p));
  x5 = _mm_loadu_si128((__m128i *)(s - 4 + 5 * p));
  x6 = _mm_loadu_si128((__m128i *)(s - 4 + 6 * p));
  x7 = _mm_loadu_si128((__m128i *)(s - 4 + 7 * p));

  highbd_transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0, &d1,
                           &d2, &d3, &d4, &d5, &d6, &d7);

  highbd_lpf_internal_8_dual_sse2(&d0, &d7, &d1, &d6, &d2, &d5, &d3, &d4,
                                  blimit0, limit0, thresh0, blimit1, limit1,
                                  thresh1, bd);

  highbd_transpose8x8_sse2(&d0, &d1, &d2, &d3, &d4, &d5, &d6, &d7, &x0, &x1,
                           &x2, &x3, &x4, &x5, &x6, &x7);

  _mm_storeu_si128((__m128i *)(s - 4 + 0 * p), x0);
  _mm_storeu_si128((__m128i *)(s - 4 + 1 * p), x1);
  _mm_storeu_si128((__m128i *)(s - 4 + 2 * p), x2);
  _mm_storeu_si128((__m128i *)(s - 4 + 3 * p), x3);
  _mm_storeu_si128((__m128i *)(s - 4 + 4 * p), x4);
  _mm_storeu_si128((__m128i *)(s - 4 + 5 * p), x5);
  _mm_storeu_si128((__m128i *)(s - 4 + 6 * p), x6);
  _mm_storeu_si128((__m128i *)(s - 4 + 7 * p), x7);
}